

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx512::CurveNiIntersectorK<8,4>::
     intersect_t<embree::avx512::RibbonCurve1IntersectorK<embree::BezierCurveT,4,8>,embree::avx512::Intersect1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  int iVar2;
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [16];
  undefined1 (*pauVar5) [12];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  Primitive PVar12;
  uint uVar13;
  int iVar14;
  undefined4 uVar15;
  RTCFilterFunctionN p_Var16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined8 uVar26;
  long lVar27;
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  int iVar75;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [32];
  byte bVar87;
  byte bVar88;
  ulong uVar89;
  uint uVar90;
  uint uVar91;
  ulong uVar92;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  uint uVar93;
  Geometry *pGVar94;
  uint uVar95;
  ulong uVar96;
  long lVar97;
  byte bVar98;
  float fVar99;
  float fVar100;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  float fVar151;
  float fVar152;
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar104 [16];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar105 [16];
  float fVar153;
  float fVar155;
  float fVar156;
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  float fVar154;
  float fVar157;
  float fVar158;
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  float fVar159;
  undefined4 uVar160;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined8 uVar161;
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  float fVar177;
  float fVar178;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  float fVar189;
  undefined1 auVar188 [64];
  float fVar190;
  float fVar195;
  float fVar196;
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [64];
  undefined1 auVar205 [16];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [16];
  undefined1 auVar209 [32];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [64];
  undefined1 auVar219 [64];
  undefined1 in_ZMM20 [64];
  undefined1 in_ZMM21 [64];
  undefined1 auVar220 [64];
  undefined1 auVar221 [16];
  undefined1 auVar222 [64];
  undefined1 auVar223 [64];
  undefined1 auVar224 [64];
  undefined1 auVar225 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CubicBezierCurve<embree::Vec3fx>,_8> bhit;
  undefined8 local_690;
  undefined8 uStack_688;
  Precalculations *local_678;
  undefined8 local_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  RTCFilterFunctionNArguments local_650;
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  Geometry *local_608;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5b0 [16];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  float local_520;
  float fStack_51c;
  float fStack_518;
  float fStack_514;
  undefined8 local_510;
  undefined8 uStack_508;
  undefined4 local_500;
  undefined4 uStack_4fc;
  undefined8 uStack_4f8;
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [16];
  LinearSpace3fa *local_4c8;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_450 [16];
  uint local_440;
  uint uStack_43c;
  uint uStack_438;
  uint uStack_434;
  uint uStack_430;
  uint uStack_42c;
  uint uStack_428;
  uint uStack_424;
  float local_420;
  undefined1 auStack_41c [8];
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined4 local_3a0;
  int local_39c;
  undefined1 local_390 [16];
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  byte local_350;
  float local_340 [4];
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined1 local_300 [32];
  int local_2d0;
  int iStack_2cc;
  int iStack_2c8;
  int iStack_2c4;
  undefined1 local_2c0 [16];
  undefined1 local_2b0 [16];
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  undefined4 local_290;
  undefined4 uStack_28c;
  undefined4 uStack_288;
  undefined4 uStack_284;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined1 local_270 [16];
  uint local_260;
  uint uStack_25c;
  uint uStack_258;
  uint uStack_254;
  uint uStack_250;
  uint uStack_24c;
  uint uStack_248;
  uint uStack_244;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  undefined4 uStack_124;
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar12 = prim[1];
  uVar92 = (ulong)(byte)PVar12;
  fVar190 = *(float *)(prim + uVar92 * 0x19 + 0x12);
  auVar24 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar24 = vinsertps_avx(auVar24,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar103 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar25 = vinsertps_avx(auVar103,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar104 = vsubps_avx(auVar24,*(undefined1 (*) [16])(prim + uVar92 * 0x19 + 6));
  fVar177 = fVar190 * auVar104._0_4_;
  fVar159 = fVar190 * auVar25._0_4_;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + uVar92 * 4 + 6);
  auVar113 = vpmovsxbd_avx2(auVar24);
  auVar103._8_8_ = 0;
  auVar103._0_8_ = *(ulong *)(prim + uVar92 * 5 + 6);
  auVar111 = vpmovsxbd_avx2(auVar103);
  auVar113 = vcvtdq2ps_avx(auVar113);
  auVar111 = vcvtdq2ps_avx(auVar111);
  auVar102._8_8_ = 0;
  auVar102._0_8_ = *(ulong *)(prim + uVar92 * 6 + 6);
  auVar126 = vpmovsxbd_avx2(auVar102);
  auVar126 = vcvtdq2ps_avx(auVar126);
  auVar221._8_8_ = 0;
  auVar221._0_8_ = *(ulong *)(prim + uVar92 * 0xb + 6);
  auVar127 = vpmovsxbd_avx2(auVar221);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar12 * 0xc) + 6);
  auVar124 = vpmovsxbd_avx2(auVar8);
  auVar127 = vcvtdq2ps_avx(auVar127);
  auVar125 = vcvtdq2ps_avx(auVar124);
  auVar101._8_8_ = 0;
  auVar101._0_8_ = *(ulong *)(prim + (uint)(byte)PVar12 * 0xc + uVar92 + 6);
  auVar112 = vpmovsxbd_avx2(auVar101);
  auVar112 = vcvtdq2ps_avx(auVar112);
  uVar96 = (ulong)(uint)((int)(uVar92 * 9) * 2);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar96 + 6);
  auVar114 = vpmovsxbd_avx2(auVar9);
  auVar114 = vcvtdq2ps_avx(auVar114);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar96 + uVar92 + 6);
  auVar115 = vpmovsxbd_avx2(auVar10);
  auVar115 = vcvtdq2ps_avx(auVar115);
  uVar89 = (ulong)(uint)((int)(uVar92 * 5) << 2);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar89 + 6);
  auVar110 = vpmovsxbd_avx2(auVar11);
  auVar116 = vcvtdq2ps_avx(auVar110);
  auVar213._4_4_ = fVar159;
  auVar213._0_4_ = fVar159;
  auVar213._8_4_ = fVar159;
  auVar213._12_4_ = fVar159;
  auVar213._16_4_ = fVar159;
  auVar213._20_4_ = fVar159;
  auVar213._24_4_ = fVar159;
  auVar213._28_4_ = fVar159;
  auVar215._8_4_ = 1;
  auVar215._0_8_ = 0x100000001;
  auVar215._12_4_ = 1;
  auVar215._16_4_ = 1;
  auVar215._20_4_ = 1;
  auVar215._24_4_ = 1;
  auVar215._28_4_ = 1;
  auVar108 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar118 = ZEXT1632(CONCAT412(fVar190 * auVar25._12_4_,
                                CONCAT48(fVar190 * auVar25._8_4_,
                                         CONCAT44(fVar190 * auVar25._4_4_,fVar159))));
  auVar117 = vpermps_avx2(auVar215,auVar118);
  auVar109 = vpermps_avx512vl(auVar108,auVar118);
  fVar159 = auVar109._0_4_;
  fVar195 = auVar109._4_4_;
  auVar118._4_4_ = fVar195 * auVar126._4_4_;
  auVar118._0_4_ = fVar159 * auVar126._0_4_;
  fVar196 = auVar109._8_4_;
  auVar118._8_4_ = fVar196 * auVar126._8_4_;
  fVar178 = auVar109._12_4_;
  auVar118._12_4_ = fVar178 * auVar126._12_4_;
  fVar189 = auVar109._16_4_;
  auVar118._16_4_ = fVar189 * auVar126._16_4_;
  fVar99 = auVar109._20_4_;
  auVar118._20_4_ = fVar99 * auVar126._20_4_;
  fVar100 = auVar109._24_4_;
  auVar118._24_4_ = fVar100 * auVar126._24_4_;
  auVar118._28_4_ = auVar124._28_4_;
  auVar124._4_4_ = auVar112._4_4_ * fVar195;
  auVar124._0_4_ = auVar112._0_4_ * fVar159;
  auVar124._8_4_ = auVar112._8_4_ * fVar196;
  auVar124._12_4_ = auVar112._12_4_ * fVar178;
  auVar124._16_4_ = auVar112._16_4_ * fVar189;
  auVar124._20_4_ = auVar112._20_4_ * fVar99;
  auVar124._24_4_ = auVar112._24_4_ * fVar100;
  auVar124._28_4_ = auVar110._28_4_;
  auVar110._4_4_ = auVar116._4_4_ * fVar195;
  auVar110._0_4_ = auVar116._0_4_ * fVar159;
  auVar110._8_4_ = auVar116._8_4_ * fVar196;
  auVar110._12_4_ = auVar116._12_4_ * fVar178;
  auVar110._16_4_ = auVar116._16_4_ * fVar189;
  auVar110._20_4_ = auVar116._20_4_ * fVar99;
  auVar110._24_4_ = auVar116._24_4_ * fVar100;
  auVar110._28_4_ = auVar109._28_4_;
  auVar24 = vfmadd231ps_fma(auVar118,auVar117,auVar111);
  auVar103 = vfmadd231ps_fma(auVar124,auVar117,auVar125);
  auVar102 = vfmadd231ps_fma(auVar110,auVar115,auVar117);
  auVar24 = vfmadd231ps_fma(ZEXT1632(auVar24),auVar213,auVar113);
  auVar103 = vfmadd231ps_fma(ZEXT1632(auVar103),auVar213,auVar127);
  auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar114,auVar213);
  auVar214._4_4_ = fVar177;
  auVar214._0_4_ = fVar177;
  auVar214._8_4_ = fVar177;
  auVar214._12_4_ = fVar177;
  auVar214._16_4_ = fVar177;
  auVar214._20_4_ = fVar177;
  auVar214._24_4_ = fVar177;
  auVar214._28_4_ = fVar177;
  auVar110 = ZEXT1632(CONCAT412(fVar190 * auVar104._12_4_,
                                CONCAT48(fVar190 * auVar104._8_4_,
                                         CONCAT44(fVar190 * auVar104._4_4_,fVar177))));
  auVar124 = vpermps_avx2(auVar215,auVar110);
  auVar110 = vpermps_avx512vl(auVar108,auVar110);
  fVar190 = auVar110._0_4_;
  fVar159 = auVar110._4_4_;
  auVar117._4_4_ = fVar159 * auVar126._4_4_;
  auVar117._0_4_ = fVar190 * auVar126._0_4_;
  fVar195 = auVar110._8_4_;
  auVar117._8_4_ = fVar195 * auVar126._8_4_;
  fVar196 = auVar110._12_4_;
  auVar117._12_4_ = fVar196 * auVar126._12_4_;
  fVar178 = auVar110._16_4_;
  auVar117._16_4_ = fVar178 * auVar126._16_4_;
  fVar189 = auVar110._20_4_;
  auVar117._20_4_ = fVar189 * auVar126._20_4_;
  fVar99 = auVar110._24_4_;
  auVar117._24_4_ = fVar99 * auVar126._24_4_;
  auVar117._28_4_ = 1;
  auVar108._4_4_ = auVar112._4_4_ * fVar159;
  auVar108._0_4_ = auVar112._0_4_ * fVar190;
  auVar108._8_4_ = auVar112._8_4_ * fVar195;
  auVar108._12_4_ = auVar112._12_4_ * fVar196;
  auVar108._16_4_ = auVar112._16_4_ * fVar178;
  auVar108._20_4_ = auVar112._20_4_ * fVar189;
  auVar108._24_4_ = auVar112._24_4_ * fVar99;
  auVar108._28_4_ = auVar126._28_4_;
  auVar112._4_4_ = auVar116._4_4_ * fVar159;
  auVar112._0_4_ = auVar116._0_4_ * fVar190;
  auVar112._8_4_ = auVar116._8_4_ * fVar195;
  auVar112._12_4_ = auVar116._12_4_ * fVar196;
  auVar112._16_4_ = auVar116._16_4_ * fVar178;
  auVar112._20_4_ = auVar116._20_4_ * fVar189;
  auVar112._24_4_ = auVar116._24_4_ * fVar99;
  auVar112._28_4_ = auVar110._28_4_;
  auVar221 = vfmadd231ps_fma(auVar117,auVar124,auVar111);
  auVar8 = vfmadd231ps_fma(auVar108,auVar124,auVar125);
  auVar101 = vfmadd231ps_fma(auVar112,auVar124,auVar115);
  auVar221 = vfmadd231ps_fma(ZEXT1632(auVar221),auVar214,auVar113);
  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar214,auVar127);
  auVar206._8_4_ = 0x7fffffff;
  auVar206._0_8_ = 0x7fffffff7fffffff;
  auVar206._12_4_ = 0x7fffffff;
  auVar206._16_4_ = 0x7fffffff;
  auVar206._20_4_ = 0x7fffffff;
  auVar206._24_4_ = 0x7fffffff;
  auVar206._28_4_ = 0x7fffffff;
  auVar101 = vfmadd231ps_fma(ZEXT1632(auVar101),auVar214,auVar114);
  auVar113 = vandps_avx(ZEXT1632(auVar24),auVar206);
  auVar123._8_4_ = 0x219392ef;
  auVar123._0_8_ = 0x219392ef219392ef;
  auVar123._12_4_ = 0x219392ef;
  auVar123._16_4_ = 0x219392ef;
  auVar123._20_4_ = 0x219392ef;
  auVar123._24_4_ = 0x219392ef;
  auVar123._28_4_ = 0x219392ef;
  uVar96 = vcmpps_avx512vl(auVar113,auVar123,1);
  bVar17 = (bool)((byte)uVar96 & 1);
  auVar109._0_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar24._0_4_;
  bVar17 = (bool)((byte)(uVar96 >> 1) & 1);
  auVar109._4_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar24._4_4_;
  bVar17 = (bool)((byte)(uVar96 >> 2) & 1);
  auVar109._8_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar24._8_4_;
  bVar17 = (bool)((byte)(uVar96 >> 3) & 1);
  auVar109._12_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar24._12_4_;
  auVar109._16_4_ = (uint)((byte)(uVar96 >> 4) & 1) * 0x219392ef;
  auVar109._20_4_ = (uint)((byte)(uVar96 >> 5) & 1) * 0x219392ef;
  auVar109._24_4_ = (uint)((byte)(uVar96 >> 6) & 1) * 0x219392ef;
  auVar109._28_4_ = (uint)(byte)(uVar96 >> 7) * 0x219392ef;
  auVar113 = vandps_avx(ZEXT1632(auVar103),auVar206);
  uVar96 = vcmpps_avx512vl(auVar113,auVar123,1);
  bVar17 = (bool)((byte)uVar96 & 1);
  auVar119._0_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar103._0_4_;
  bVar17 = (bool)((byte)(uVar96 >> 1) & 1);
  auVar119._4_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar103._4_4_;
  bVar17 = (bool)((byte)(uVar96 >> 2) & 1);
  auVar119._8_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar103._8_4_;
  bVar17 = (bool)((byte)(uVar96 >> 3) & 1);
  auVar119._12_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar103._12_4_;
  auVar119._16_4_ = (uint)((byte)(uVar96 >> 4) & 1) * 0x219392ef;
  auVar119._20_4_ = (uint)((byte)(uVar96 >> 5) & 1) * 0x219392ef;
  auVar119._24_4_ = (uint)((byte)(uVar96 >> 6) & 1) * 0x219392ef;
  auVar119._28_4_ = (uint)(byte)(uVar96 >> 7) * 0x219392ef;
  auVar113 = vandps_avx(ZEXT1632(auVar102),auVar206);
  uVar96 = vcmpps_avx512vl(auVar113,auVar123,1);
  bVar17 = (bool)((byte)uVar96 & 1);
  auVar113._0_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar102._0_4_;
  bVar17 = (bool)((byte)(uVar96 >> 1) & 1);
  auVar113._4_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar102._4_4_;
  bVar17 = (bool)((byte)(uVar96 >> 2) & 1);
  auVar113._8_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar102._8_4_;
  bVar17 = (bool)((byte)(uVar96 >> 3) & 1);
  auVar113._12_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar102._12_4_;
  auVar113._16_4_ = (uint)((byte)(uVar96 >> 4) & 1) * 0x219392ef;
  auVar113._20_4_ = (uint)((byte)(uVar96 >> 5) & 1) * 0x219392ef;
  auVar113._24_4_ = (uint)((byte)(uVar96 >> 6) & 1) * 0x219392ef;
  auVar113._28_4_ = (uint)(byte)(uVar96 >> 7) * 0x219392ef;
  auVar111 = vrcp14ps_avx512vl(auVar109);
  auVar203._8_4_ = 0x3f800000;
  auVar203._0_8_ = &DAT_3f8000003f800000;
  auVar203._12_4_ = 0x3f800000;
  auVar203._16_4_ = 0x3f800000;
  auVar203._20_4_ = 0x3f800000;
  auVar203._24_4_ = 0x3f800000;
  auVar203._28_4_ = 0x3f800000;
  auVar24 = vfnmadd213ps_fma(auVar109,auVar111,auVar203);
  auVar24 = vfmadd132ps_fma(ZEXT1632(auVar24),auVar111,auVar111);
  auVar111 = vrcp14ps_avx512vl(auVar119);
  auVar103 = vfnmadd213ps_fma(auVar119,auVar111,auVar203);
  auVar103 = vfmadd132ps_fma(ZEXT1632(auVar103),auVar111,auVar111);
  auVar111 = vrcp14ps_avx512vl(auVar113);
  auVar102 = vfnmadd213ps_fma(auVar113,auVar111,auVar203);
  auVar102 = vfmadd132ps_fma(ZEXT1632(auVar102),auVar111,auVar111);
  auVar113 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar92 * 7 + 6));
  auVar113 = vcvtdq2ps_avx(auVar113);
  auVar113 = vsubps_avx(auVar113,ZEXT1632(auVar221));
  auVar114._4_4_ = auVar24._4_4_ * auVar113._4_4_;
  auVar114._0_4_ = auVar24._0_4_ * auVar113._0_4_;
  auVar114._8_4_ = auVar24._8_4_ * auVar113._8_4_;
  auVar114._12_4_ = auVar24._12_4_ * auVar113._12_4_;
  auVar114._16_4_ = auVar113._16_4_ * 0.0;
  auVar114._20_4_ = auVar113._20_4_ * 0.0;
  auVar114._24_4_ = auVar113._24_4_ * 0.0;
  auVar114._28_4_ = auVar113._28_4_;
  auVar113 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar92 * 9 + 6));
  auVar113 = vcvtdq2ps_avx(auVar113);
  auVar113 = vsubps_avx(auVar113,ZEXT1632(auVar221));
  auVar112 = vpbroadcastd_avx512vl();
  auVar111 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar12 * 0x10 + 6));
  auVar122._0_4_ = auVar24._0_4_ * auVar113._0_4_;
  auVar122._4_4_ = auVar24._4_4_ * auVar113._4_4_;
  auVar122._8_4_ = auVar24._8_4_ * auVar113._8_4_;
  auVar122._12_4_ = auVar24._12_4_ * auVar113._12_4_;
  auVar122._16_4_ = auVar113._16_4_ * 0.0;
  auVar122._20_4_ = auVar113._20_4_ * 0.0;
  auVar122._24_4_ = auVar113._24_4_ * 0.0;
  auVar122._28_4_ = 0;
  auVar113 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + (ulong)(byte)PVar12 * 0x10 + uVar92 * -2 + 6));
  auVar113 = vcvtdq2ps_avx(auVar113);
  auVar113 = vsubps_avx(auVar113,ZEXT1632(auVar8));
  auVar115._4_4_ = auVar103._4_4_ * auVar113._4_4_;
  auVar115._0_4_ = auVar103._0_4_ * auVar113._0_4_;
  auVar115._8_4_ = auVar103._8_4_ * auVar113._8_4_;
  auVar115._12_4_ = auVar103._12_4_ * auVar113._12_4_;
  auVar115._16_4_ = auVar113._16_4_ * 0.0;
  auVar115._20_4_ = auVar113._20_4_ * 0.0;
  auVar115._24_4_ = auVar113._24_4_ * 0.0;
  auVar115._28_4_ = auVar113._28_4_;
  auVar204 = ZEXT3264(auVar115);
  auVar113 = vcvtdq2ps_avx(auVar111);
  auVar113 = vsubps_avx(auVar113,ZEXT1632(auVar8));
  auVar121._0_4_ = auVar103._0_4_ * auVar113._0_4_;
  auVar121._4_4_ = auVar103._4_4_ * auVar113._4_4_;
  auVar121._8_4_ = auVar103._8_4_ * auVar113._8_4_;
  auVar121._12_4_ = auVar103._12_4_ * auVar113._12_4_;
  auVar121._16_4_ = auVar113._16_4_ * 0.0;
  auVar121._20_4_ = auVar113._20_4_ * 0.0;
  auVar121._24_4_ = auVar113._24_4_ * 0.0;
  auVar121._28_4_ = 0;
  auVar113 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar89 + uVar92 + 6));
  auVar113 = vcvtdq2ps_avx(auVar113);
  auVar113 = vsubps_avx(auVar113,ZEXT1632(auVar101));
  auVar116._4_4_ = auVar113._4_4_ * auVar102._4_4_;
  auVar116._0_4_ = auVar113._0_4_ * auVar102._0_4_;
  auVar116._8_4_ = auVar113._8_4_ * auVar102._8_4_;
  auVar116._12_4_ = auVar113._12_4_ * auVar102._12_4_;
  auVar116._16_4_ = auVar113._16_4_ * 0.0;
  auVar116._20_4_ = auVar113._20_4_ * 0.0;
  auVar116._24_4_ = auVar113._24_4_ * 0.0;
  auVar116._28_4_ = auVar113._28_4_;
  auVar113 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar92 * 0x17 + 6));
  auVar113 = vcvtdq2ps_avx(auVar113);
  auVar113 = vsubps_avx(auVar113,ZEXT1632(auVar101));
  auVar120._0_4_ = auVar102._0_4_ * auVar113._0_4_;
  auVar120._4_4_ = auVar102._4_4_ * auVar113._4_4_;
  auVar120._8_4_ = auVar102._8_4_ * auVar113._8_4_;
  auVar120._12_4_ = auVar102._12_4_ * auVar113._12_4_;
  auVar120._16_4_ = auVar113._16_4_ * 0.0;
  auVar120._20_4_ = auVar113._20_4_ * 0.0;
  auVar120._24_4_ = auVar113._24_4_ * 0.0;
  auVar120._28_4_ = 0;
  auVar113 = vpminsd_avx2(auVar114,auVar122);
  auVar111 = vpminsd_avx2(auVar115,auVar121);
  auVar113 = vmaxps_avx(auVar113,auVar111);
  auVar111 = vpminsd_avx2(auVar116,auVar120);
  uVar160 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar126._4_4_ = uVar160;
  auVar126._0_4_ = uVar160;
  auVar126._8_4_ = uVar160;
  auVar126._12_4_ = uVar160;
  auVar126._16_4_ = uVar160;
  auVar126._20_4_ = uVar160;
  auVar126._24_4_ = uVar160;
  auVar126._28_4_ = uVar160;
  auVar111 = vmaxps_avx512vl(auVar111,auVar126);
  auVar113 = vmaxps_avx(auVar113,auVar111);
  auVar111._8_4_ = 0x3f7ffffa;
  auVar111._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar111._12_4_ = 0x3f7ffffa;
  auVar111._16_4_ = 0x3f7ffffa;
  auVar111._20_4_ = 0x3f7ffffa;
  auVar111._24_4_ = 0x3f7ffffa;
  auVar111._28_4_ = 0x3f7ffffa;
  local_80 = vmulps_avx512vl(auVar113,auVar111);
  auVar188 = ZEXT3264(local_80);
  auVar113 = vpmaxsd_avx2(auVar114,auVar122);
  auVar111 = vpmaxsd_avx2(auVar115,auVar121);
  auVar113 = vminps_avx(auVar113,auVar111);
  auVar111 = vpmaxsd_avx2(auVar116,auVar120);
  uVar160 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar127._4_4_ = uVar160;
  auVar127._0_4_ = uVar160;
  auVar127._8_4_ = uVar160;
  auVar127._12_4_ = uVar160;
  auVar127._16_4_ = uVar160;
  auVar127._20_4_ = uVar160;
  auVar127._24_4_ = uVar160;
  auVar127._28_4_ = uVar160;
  auVar111 = vminps_avx512vl(auVar111,auVar127);
  auVar113 = vminps_avx(auVar113,auVar111);
  auVar125._8_4_ = 0x3f800003;
  auVar125._0_8_ = 0x3f8000033f800003;
  auVar125._12_4_ = 0x3f800003;
  auVar125._16_4_ = 0x3f800003;
  auVar125._20_4_ = 0x3f800003;
  auVar125._24_4_ = 0x3f800003;
  auVar125._28_4_ = 0x3f800003;
  auVar113 = vmulps_avx512vl(auVar113,auVar125);
  uVar26 = vpcmpgtd_avx512vl(auVar112,_DAT_0205a920);
  uVar161 = vcmpps_avx512vl(local_80,auVar113,2);
  if ((byte)((byte)uVar161 & (byte)uVar26) != 0) {
    uVar96 = (ulong)(byte)((byte)uVar161 & (byte)uVar26);
    local_4c8 = pre->ray_space + k;
    local_450 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
    local_678 = pre;
    do {
      auVar111 = auVar204._0_32_;
      auVar113 = auVar188._0_32_;
      local_560 = in_ZMM21._0_32_;
      local_540 = in_ZMM20._0_32_;
      lVar27 = 0;
      for (uVar89 = uVar96; (uVar89 & 1) == 0; uVar89 = uVar89 >> 1 | 0x8000000000000000) {
        lVar27 = lVar27 + 1;
      }
      uVar95 = *(uint *)(prim + 2);
      uVar13 = *(uint *)(prim + lVar27 * 4 + 6);
      pGVar94 = (context->scene->geometries).items[uVar95].ptr;
      uVar89 = (ulong)*(uint *)(*(long *)&pGVar94->field_0x58 +
                               pGVar94[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i * (ulong)uVar13);
      p_Var16 = pGVar94[1].intersectionFilterN;
      lVar27 = *(long *)&pGVar94[1].time_range.upper;
      auVar24 = *(undefined1 (*) [16])(lVar27 + (long)p_Var16 * uVar89);
      pauVar3 = (undefined1 (*) [16])(lVar27 + (uVar89 + 1) * (long)p_Var16);
      local_660 = *(undefined8 *)*pauVar3;
      uStack_658 = *(undefined8 *)(*pauVar3 + 8);
      auVar103 = *pauVar3;
      pauVar4 = (undefined1 (*) [16])(lVar27 + (uVar89 + 2) * (long)p_Var16);
      local_670 = *(undefined8 *)*pauVar4;
      uStack_668 = *(undefined8 *)(*pauVar4 + 8);
      auVar102 = *pauVar4;
      uVar96 = uVar96 - 1 & uVar96;
      pauVar5 = (undefined1 (*) [12])(lVar27 + (uVar89 + 3) * (long)p_Var16);
      local_360 = *(undefined8 *)*pauVar5;
      uStack_358 = *(undefined8 *)(*pauVar5 + 8);
      local_620 = (float)local_360;
      fStack_61c = (float)((ulong)local_360 >> 0x20);
      fStack_618 = (float)uStack_358;
      fStack_614 = (float)((ulong)uStack_358 >> 0x20);
      if (uVar96 != 0) {
        uVar92 = uVar96 - 1 & uVar96;
        for (uVar89 = uVar96; (uVar89 & 1) == 0; uVar89 = uVar89 >> 1 | 0x8000000000000000) {
        }
        if (uVar92 != 0) {
          for (; (uVar92 & 1) == 0; uVar92 = uVar92 >> 1 | 0x8000000000000000) {
          }
        }
      }
      iVar14 = (int)pGVar94[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar221 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x1c);
      auVar221 = vinsertps_avx(auVar221,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
      auVar101 = vsubps_avx(auVar24,auVar221);
      uVar160 = auVar101._0_4_;
      auVar104._4_4_ = uVar160;
      auVar104._0_4_ = uVar160;
      auVar104._8_4_ = uVar160;
      auVar104._12_4_ = uVar160;
      auVar8 = vshufps_avx(auVar101,auVar101,0x55);
      auVar101 = vshufps_avx(auVar101,auVar101,0xaa);
      aVar6 = (local_4c8->vx).field_0;
      aVar7 = (local_4c8->vy).field_0;
      fVar190 = (local_4c8->vz).field_0.m128[0];
      fVar159 = *(float *)((long)&(local_4c8->vz).field_0 + 4);
      fVar195 = *(float *)((long)&(local_4c8->vz).field_0 + 8);
      fVar196 = *(float *)((long)&(local_4c8->vz).field_0 + 0xc);
      auVar105._0_4_ = fVar190 * auVar101._0_4_;
      auVar105._4_4_ = fVar159 * auVar101._4_4_;
      auVar105._8_4_ = fVar195 * auVar101._8_4_;
      auVar105._12_4_ = fVar196 * auVar101._12_4_;
      auVar8 = vfmadd231ps_fma(auVar105,(undefined1  [16])aVar7,auVar8);
      auVar10 = vfmadd231ps_fma(auVar8,(undefined1  [16])aVar6,auVar104);
      auVar8 = vshufps_avx(auVar24,auVar24,0xff);
      auVar9 = vsubps_avx(auVar103,auVar221);
      uVar160 = auVar9._0_4_;
      auVar179._4_4_ = uVar160;
      auVar179._0_4_ = uVar160;
      auVar179._8_4_ = uVar160;
      auVar179._12_4_ = uVar160;
      auVar101 = vshufps_avx(auVar9,auVar9,0x55);
      auVar9 = vshufps_avx(auVar9,auVar9,0xaa);
      auVar208._0_4_ = fVar190 * auVar9._0_4_;
      auVar208._4_4_ = fVar159 * auVar9._4_4_;
      auVar208._8_4_ = fVar195 * auVar9._8_4_;
      auVar208._12_4_ = fVar196 * auVar9._12_4_;
      auVar101 = vfmadd231ps_fma(auVar208,(undefined1  [16])aVar7,auVar101);
      auVar11 = vfmadd231ps_fma(auVar101,(undefined1  [16])aVar6,auVar179);
      auVar103 = vshufps_avx(auVar103,auVar103,0xff);
      auVar9 = vsubps_avx(auVar102,auVar221);
      uVar160 = auVar9._0_4_;
      auVar205._4_4_ = uVar160;
      auVar205._0_4_ = uVar160;
      auVar205._8_4_ = uVar160;
      auVar205._12_4_ = uVar160;
      auVar101 = vshufps_avx(auVar9,auVar9,0x55);
      auVar9 = vshufps_avx(auVar9,auVar9,0xaa);
      auVar210._0_4_ = fVar190 * auVar9._0_4_;
      auVar210._4_4_ = fVar159 * auVar9._4_4_;
      auVar210._8_4_ = fVar195 * auVar9._8_4_;
      auVar210._12_4_ = fVar196 * auVar9._12_4_;
      auVar101 = vfmadd231ps_fma(auVar210,(undefined1  [16])aVar7,auVar101);
      auVar9 = vfmadd231ps_fma(auVar101,(undefined1  [16])aVar6,auVar205);
      auVar102 = vshufps_avx(auVar102,auVar102,0xff);
      auVar25._12_4_ = fStack_614;
      auVar25._0_12_ = *pauVar5;
      auVar101 = vsubps_avx512vl(auVar25,auVar221);
      uVar160 = auVar101._0_4_;
      auVar180._4_4_ = uVar160;
      auVar180._0_4_ = uVar160;
      auVar180._8_4_ = uVar160;
      auVar180._12_4_ = uVar160;
      auVar221 = vshufps_avx(auVar101,auVar101,0x55);
      auVar101 = vshufps_avx(auVar101,auVar101,0xaa);
      auVar211._0_4_ = fVar190 * auVar101._0_4_;
      auVar211._4_4_ = fVar159 * auVar101._4_4_;
      auVar211._8_4_ = fVar195 * auVar101._8_4_;
      auVar211._12_4_ = fVar196 * auVar101._12_4_;
      auVar221 = vfmadd231ps_fma(auVar211,(undefined1  [16])aVar7,auVar221);
      auVar221 = vfmadd231ps_fma(auVar221,(undefined1  [16])aVar6,auVar180);
      lVar27 = (long)iVar14 * 0x44;
      auVar126 = *(undefined1 (*) [32])(bezier_basis0 + lVar27);
      auVar101 = vshufps_avx512vl(auVar25,auVar25,0xff);
      local_4a0 = vbroadcastss_avx512vl(auVar10);
      auVar185._8_4_ = 1;
      auVar185._0_8_ = 0x100000001;
      auVar185._12_4_ = 1;
      auVar185._16_4_ = 1;
      auVar185._20_4_ = 1;
      auVar185._24_4_ = 1;
      auVar185._28_4_ = 1;
      local_5e0 = vpermps_avx512vl(auVar185,ZEXT1632(auVar10));
      uVar161 = auVar8._0_8_;
      local_a0._8_8_ = uVar161;
      local_a0._0_8_ = uVar161;
      local_a0._16_8_ = uVar161;
      local_a0._24_8_ = uVar161;
      auVar127 = *(undefined1 (*) [32])(bezier_basis0 + lVar27 + 0x484);
      uVar160 = auVar11._0_4_;
      local_600._4_4_ = uVar160;
      local_600._0_4_ = uVar160;
      local_600._8_4_ = uVar160;
      local_600._12_4_ = uVar160;
      local_600._16_4_ = uVar160;
      local_600._20_4_ = uVar160;
      local_600._24_4_ = uVar160;
      local_600._28_4_ = uVar160;
      local_1e0 = vpermps_avx512vl(auVar185,ZEXT1632(auVar11));
      local_c0 = vbroadcastsd_avx512vl(auVar103);
      auVar125 = *(undefined1 (*) [32])(bezier_basis0 + lVar27 + 0x908);
      local_e0 = vbroadcastss_avx512vl(auVar9);
      local_100 = vpermps_avx512vl(auVar185,ZEXT1632(auVar9));
      local_120 = vbroadcastsd_avx512vl(auVar102);
      auVar112 = *(undefined1 (*) [32])(bezier_basis0 + lVar27 + 0xd8c);
      local_580 = vbroadcastss_avx512vl(auVar221);
      auVar224 = ZEXT3264(local_580);
      local_5a0 = vpermps_avx512vl(auVar185,ZEXT1632(auVar221));
      auVar225 = ZEXT3264(local_5a0);
      uVar161 = auVar101._0_8_;
      register0x000012c8 = uVar161;
      local_140 = uVar161;
      register0x000012d0 = uVar161;
      register0x000012d8 = uVar161;
      auVar114 = vmulps_avx512vl(local_580,auVar112);
      auVar115 = vmulps_avx512vl(local_5a0,auVar112);
      auVar114 = vfmadd231ps_avx512vl(auVar114,auVar125,local_e0);
      auVar115 = vfmadd231ps_avx512vl(auVar115,auVar125,local_100);
      auVar103 = vfmadd231ps_fma(auVar114,auVar127,local_600);
      auVar116 = vfmadd231ps_avx512vl(auVar115,auVar127,local_1e0);
      auVar110 = vfmadd231ps_avx512vl(ZEXT1632(auVar103),auVar126,local_4a0);
      auVar114 = *(undefined1 (*) [32])(bezier_basis1 + lVar27);
      auVar115 = *(undefined1 (*) [32])(bezier_basis1 + lVar27 + 0x484);
      auVar117 = vfmadd231ps_avx512vl(auVar116,auVar126,local_5e0);
      auVar116 = *(undefined1 (*) [32])(bezier_basis1 + lVar27 + 0x908);
      auVar124 = *(undefined1 (*) [32])(bezier_basis1 + lVar27 + 0xd8c);
      auVar118 = vmulps_avx512vl(local_580,auVar124);
      auVar108 = vmulps_avx512vl(local_5a0,auVar124);
      auVar118 = vfmadd231ps_avx512vl(auVar118,auVar116,local_e0);
      auVar108 = vfmadd231ps_avx512vl(auVar108,auVar116,local_100);
      auVar118 = vfmadd231ps_avx512vl(auVar118,auVar115,local_600);
      auVar108 = vfmadd231ps_avx512vl(auVar108,auVar115,local_1e0);
      auVar118 = vfmadd231ps_avx512vl(auVar118,auVar114,local_4a0);
      auVar108 = vfmadd231ps_avx512vl(auVar108,auVar114,local_5e0);
      auVar109 = vsubps_avx512vl(auVar118,auVar110);
      auVar119 = vsubps_avx512vl(auVar108,auVar117);
      auVar120 = vmulps_avx512vl(auVar117,auVar109);
      auVar121 = vmulps_avx512vl(auVar110,auVar119);
      auVar120 = vsubps_avx512vl(auVar120,auVar121);
      auVar121 = vmulps_avx512vl(_local_140,auVar112);
      auVar121 = vfmadd231ps_avx512vl(auVar121,auVar125,local_120);
      auVar121 = vfmadd231ps_avx512vl(auVar121,auVar127,local_c0);
      auVar121 = vfmadd231ps_avx512vl(auVar121,auVar126,local_a0);
      auVar122 = vmulps_avx512vl(_local_140,auVar124);
      auVar122 = vfmadd231ps_avx512vl(auVar122,auVar116,local_120);
      auVar122 = vfmadd231ps_avx512vl(auVar122,auVar115,local_c0);
      auVar8 = vfmadd231ps_fma(auVar122,auVar114,local_a0);
      auVar122 = vmulps_avx512vl(auVar119,auVar119);
      auVar122 = vfmadd231ps_avx512vl(auVar122,auVar109,auVar109);
      auVar123 = vmaxps_avx512vl(auVar121,ZEXT1632(auVar8));
      auVar123 = vmulps_avx512vl(auVar123,auVar123);
      auVar122 = vmulps_avx512vl(auVar123,auVar122);
      auVar120 = vmulps_avx512vl(auVar120,auVar120);
      uVar161 = vcmpps_avx512vl(auVar120,auVar122,2);
      auVar103 = vblendps_avx(auVar10,auVar24,8);
      auVar101 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar102 = vandps_avx512vl(auVar103,auVar101);
      auVar103 = vblendps_avx(auVar11,*pauVar3,8);
      auVar103 = vandps_avx512vl(auVar103,auVar101);
      auVar102 = vmaxps_avx(auVar102,auVar103);
      auVar103 = vblendps_avx(auVar9,*pauVar4,8);
      auVar104 = vandps_avx512vl(auVar103,auVar101);
      auVar103 = vblendps_avx(auVar221,auVar25,8);
      auVar103 = vandps_avx512vl(auVar103,auVar101);
      auVar103 = vmaxps_avx(auVar104,auVar103);
      auVar103 = vmaxps_avx(auVar102,auVar103);
      auVar102 = vmovshdup_avx(auVar103);
      auVar102 = vmaxss_avx(auVar102,auVar103);
      auVar103 = vshufpd_avx(auVar103,auVar103,1);
      auVar103 = vmaxss_avx(auVar103,auVar102);
      auVar212._0_4_ = (float)iVar14;
      _auStack_41c = auVar10._4_12_;
      auVar212._4_4_ = auVar212._0_4_;
      auVar212._8_4_ = auVar212._0_4_;
      auVar212._12_4_ = auVar212._0_4_;
      auVar212._16_4_ = auVar212._0_4_;
      auVar212._20_4_ = auVar212._0_4_;
      auVar212._24_4_ = auVar212._0_4_;
      auVar212._28_4_ = auVar212._0_4_;
      uVar26 = vcmpps_avx512vl(auVar212,_DAT_02020f40,0xe);
      bVar98 = (byte)uVar161 & (byte)uVar26;
      auVar103 = vmulss_avx512f(auVar103,ZEXT416(0x35000000));
      auVar186._8_4_ = 2;
      auVar186._0_8_ = 0x200000002;
      auVar186._12_4_ = 2;
      auVar186._16_4_ = 2;
      auVar186._20_4_ = 2;
      auVar186._24_4_ = 2;
      auVar186._28_4_ = 2;
      local_160 = vpermps_avx512vl(auVar186,ZEXT1632(auVar10));
      local_180 = vpermps_avx512vl(auVar186,ZEXT1632(auVar11));
      local_1a0 = vpermps_avx512vl(auVar186,ZEXT1632(auVar9));
      local_1c0 = vpermps_avx2(auVar186,ZEXT1632(auVar221));
      uVar93 = *(uint *)(ray + k * 4 + 0x30);
      auVar102 = auVar119._0_16_;
      local_420 = auVar212._0_4_;
      if (bVar98 == 0) {
        auVar102 = vxorps_avx512vl(auVar102,auVar102);
        auVar222 = ZEXT1664(auVar102);
        auVar204 = ZEXT3264(auVar111);
        in_ZMM20 = ZEXT3264(local_540);
        auVar188 = ZEXT3264(auVar113);
        in_ZMM21 = ZEXT3264(local_560);
        auVar220 = ZEXT3264(local_4a0);
        auVar218 = ZEXT3264(local_5e0);
        auVar219 = ZEXT3264(local_600);
      }
      else {
        local_4c0._0_16_ = ZEXT416(uVar93);
        local_480._0_16_ = auVar103;
        auVar124 = vmulps_avx512vl(local_1c0,auVar124);
        auVar116 = vfmadd213ps_avx512vl(auVar116,local_1a0,auVar124);
        auVar115 = vfmadd213ps_avx512vl(auVar115,local_180,auVar116);
        auVar115 = vfmadd213ps_avx512vl(auVar114,local_160,auVar115);
        auVar112 = vmulps_avx512vl(local_1c0,auVar112);
        auVar125 = vfmadd213ps_avx512vl(auVar125,local_1a0,auVar112);
        auVar116 = vfmadd213ps_avx512vl(auVar127,local_180,auVar125);
        auVar127 = *(undefined1 (*) [32])(bezier_basis0 + lVar27 + 0x1210);
        auVar125 = *(undefined1 (*) [32])(bezier_basis0 + lVar27 + 0x1694);
        auVar112 = *(undefined1 (*) [32])(bezier_basis0 + lVar27 + 0x1b18);
        auVar114 = *(undefined1 (*) [32])(bezier_basis0 + lVar27 + 0x1f9c);
        auVar116 = vfmadd213ps_avx512vl(auVar126,local_160,auVar116);
        auVar126 = vmulps_avx512vl(local_580,auVar114);
        auVar124 = vmulps_avx512vl(local_5a0,auVar114);
        auVar114 = vmulps_avx512vl(local_1c0,auVar114);
        auVar126 = vfmadd231ps_avx512vl(auVar126,auVar112,local_e0);
        auVar124 = vfmadd231ps_avx512vl(auVar124,auVar112,local_100);
        auVar112 = vfmadd231ps_avx512vl(auVar114,local_1a0,auVar112);
        auVar219 = ZEXT3264(local_600);
        auVar126 = vfmadd231ps_avx512vl(auVar126,auVar125,local_600);
        auVar114 = vfmadd231ps_avx512vl(auVar124,auVar125,local_1e0);
        auVar124 = vfmadd231ps_avx512vl(auVar112,local_180,auVar125);
        auVar120 = vfmadd231ps_avx512vl(auVar126,auVar127,local_4a0);
        auVar218 = ZEXT3264(local_5e0);
        auVar114 = vfmadd231ps_avx512vl(auVar114,auVar127,local_5e0);
        auVar126 = *(undefined1 (*) [32])(bezier_basis1 + lVar27 + 0x1210);
        auVar125 = *(undefined1 (*) [32])(bezier_basis1 + lVar27 + 0x1b18);
        auVar112 = *(undefined1 (*) [32])(bezier_basis1 + lVar27 + 0x1f9c);
        auVar124 = vfmadd231ps_avx512vl(auVar124,local_160,auVar127);
        auVar127 = vmulps_avx512vl(local_580,auVar112);
        auVar122 = vmulps_avx512vl(local_5a0,auVar112);
        auVar112 = vmulps_avx512vl(local_1c0,auVar112);
        auVar223 = ZEXT1664(auVar103);
        auVar123 = vfmadd231ps_avx512vl(auVar127,auVar125,local_e0);
        auVar122 = vfmadd231ps_avx512vl(auVar122,auVar125,local_100);
        auVar125 = vfmadd231ps_avx512vl(auVar112,local_1a0,auVar125);
        auVar127 = *(undefined1 (*) [32])(bezier_basis1 + lVar27 + 0x1694);
        auVar112 = vfmadd231ps_avx512vl(auVar123,auVar127,local_600);
        auVar122 = vfmadd231ps_avx512vl(auVar122,auVar127,local_1e0);
        auVar127 = vfmadd231ps_avx512vl(auVar125,local_180,auVar127);
        auVar125 = vfmadd231ps_avx512vl(auVar112,auVar126,local_4a0);
        auVar112 = vfmadd231ps_avx512vl(auVar122,auVar126,local_5e0);
        auVar122 = vfmadd231ps_avx512vl(auVar127,local_160,auVar126);
        auVar216._8_4_ = 0x7fffffff;
        auVar216._0_8_ = 0x7fffffff7fffffff;
        auVar216._12_4_ = 0x7fffffff;
        auVar216._16_4_ = 0x7fffffff;
        auVar216._20_4_ = 0x7fffffff;
        auVar216._24_4_ = 0x7fffffff;
        auVar216._28_4_ = 0x7fffffff;
        auVar126 = vandps_avx(auVar120,auVar216);
        auVar127 = vandps_avx(auVar114,auVar216);
        auVar127 = vmaxps_avx(auVar126,auVar127);
        auVar126 = vandps_avx(auVar124,auVar216);
        auVar126 = vmaxps_avx(auVar127,auVar126);
        auVar124 = vbroadcastss_avx512vl(auVar103);
        uVar89 = vcmpps_avx512vl(auVar126,auVar124,1);
        bVar17 = (bool)((byte)uVar89 & 1);
        auVar128._0_4_ = (float)((uint)bVar17 * auVar109._0_4_ | (uint)!bVar17 * auVar120._0_4_);
        bVar17 = (bool)((byte)(uVar89 >> 1) & 1);
        auVar128._4_4_ = (float)((uint)bVar17 * auVar109._4_4_ | (uint)!bVar17 * auVar120._4_4_);
        bVar17 = (bool)((byte)(uVar89 >> 2) & 1);
        auVar128._8_4_ = (float)((uint)bVar17 * auVar109._8_4_ | (uint)!bVar17 * auVar120._8_4_);
        bVar17 = (bool)((byte)(uVar89 >> 3) & 1);
        auVar128._12_4_ = (float)((uint)bVar17 * auVar109._12_4_ | (uint)!bVar17 * auVar120._12_4_);
        bVar17 = (bool)((byte)(uVar89 >> 4) & 1);
        auVar128._16_4_ = (float)((uint)bVar17 * auVar109._16_4_ | (uint)!bVar17 * auVar120._16_4_);
        bVar17 = (bool)((byte)(uVar89 >> 5) & 1);
        auVar128._20_4_ = (float)((uint)bVar17 * auVar109._20_4_ | (uint)!bVar17 * auVar120._20_4_);
        bVar17 = (bool)((byte)(uVar89 >> 6) & 1);
        auVar128._24_4_ = (float)((uint)bVar17 * auVar109._24_4_ | (uint)!bVar17 * auVar120._24_4_);
        bVar17 = SUB81(uVar89 >> 7,0);
        auVar128._28_4_ = (uint)bVar17 * auVar109._28_4_ | (uint)!bVar17 * auVar120._28_4_;
        bVar17 = (bool)((byte)uVar89 & 1);
        auVar129._0_4_ = (float)((uint)bVar17 * auVar119._0_4_ | (uint)!bVar17 * auVar114._0_4_);
        bVar17 = (bool)((byte)(uVar89 >> 1) & 1);
        auVar129._4_4_ = (float)((uint)bVar17 * auVar119._4_4_ | (uint)!bVar17 * auVar114._4_4_);
        bVar17 = (bool)((byte)(uVar89 >> 2) & 1);
        auVar129._8_4_ = (float)((uint)bVar17 * auVar119._8_4_ | (uint)!bVar17 * auVar114._8_4_);
        bVar17 = (bool)((byte)(uVar89 >> 3) & 1);
        auVar129._12_4_ = (float)((uint)bVar17 * auVar119._12_4_ | (uint)!bVar17 * auVar114._12_4_);
        bVar17 = (bool)((byte)(uVar89 >> 4) & 1);
        auVar129._16_4_ = (float)((uint)bVar17 * auVar119._16_4_ | (uint)!bVar17 * auVar114._16_4_);
        bVar17 = (bool)((byte)(uVar89 >> 5) & 1);
        auVar129._20_4_ = (float)((uint)bVar17 * auVar119._20_4_ | (uint)!bVar17 * auVar114._20_4_);
        bVar17 = (bool)((byte)(uVar89 >> 6) & 1);
        auVar129._24_4_ = (float)((uint)bVar17 * auVar119._24_4_ | (uint)!bVar17 * auVar114._24_4_);
        bVar17 = SUB81(uVar89 >> 7,0);
        auVar129._28_4_ = (uint)bVar17 * auVar119._28_4_ | (uint)!bVar17 * auVar114._28_4_;
        auVar126 = vandps_avx(auVar216,auVar125);
        auVar127 = vandps_avx(auVar112,auVar216);
        auVar127 = vmaxps_avx(auVar126,auVar127);
        auVar126 = vandps_avx(auVar122,auVar216);
        auVar126 = vmaxps_avx(auVar127,auVar126);
        uVar89 = vcmpps_avx512vl(auVar126,auVar124,1);
        bVar17 = (bool)((byte)uVar89 & 1);
        auVar130._0_4_ = (float)((uint)bVar17 * auVar109._0_4_ | (uint)!bVar17 * auVar125._0_4_);
        bVar17 = (bool)((byte)(uVar89 >> 1) & 1);
        auVar130._4_4_ = (float)((uint)bVar17 * auVar109._4_4_ | (uint)!bVar17 * auVar125._4_4_);
        bVar17 = (bool)((byte)(uVar89 >> 2) & 1);
        auVar130._8_4_ = (float)((uint)bVar17 * auVar109._8_4_ | (uint)!bVar17 * auVar125._8_4_);
        bVar17 = (bool)((byte)(uVar89 >> 3) & 1);
        auVar130._12_4_ = (float)((uint)bVar17 * auVar109._12_4_ | (uint)!bVar17 * auVar125._12_4_);
        bVar17 = (bool)((byte)(uVar89 >> 4) & 1);
        auVar130._16_4_ = (float)((uint)bVar17 * auVar109._16_4_ | (uint)!bVar17 * auVar125._16_4_);
        bVar17 = (bool)((byte)(uVar89 >> 5) & 1);
        auVar130._20_4_ = (float)((uint)bVar17 * auVar109._20_4_ | (uint)!bVar17 * auVar125._20_4_);
        bVar17 = (bool)((byte)(uVar89 >> 6) & 1);
        auVar130._24_4_ = (float)((uint)bVar17 * auVar109._24_4_ | (uint)!bVar17 * auVar125._24_4_);
        bVar17 = SUB81(uVar89 >> 7,0);
        auVar130._28_4_ = (uint)bVar17 * auVar109._28_4_ | (uint)!bVar17 * auVar125._28_4_;
        bVar17 = (bool)((byte)uVar89 & 1);
        auVar131._0_4_ = (float)((uint)bVar17 * auVar119._0_4_ | (uint)!bVar17 * auVar112._0_4_);
        bVar17 = (bool)((byte)(uVar89 >> 1) & 1);
        auVar131._4_4_ = (float)((uint)bVar17 * auVar119._4_4_ | (uint)!bVar17 * auVar112._4_4_);
        bVar17 = (bool)((byte)(uVar89 >> 2) & 1);
        auVar131._8_4_ = (float)((uint)bVar17 * auVar119._8_4_ | (uint)!bVar17 * auVar112._8_4_);
        bVar17 = (bool)((byte)(uVar89 >> 3) & 1);
        auVar131._12_4_ = (float)((uint)bVar17 * auVar119._12_4_ | (uint)!bVar17 * auVar112._12_4_);
        bVar17 = (bool)((byte)(uVar89 >> 4) & 1);
        auVar131._16_4_ = (float)((uint)bVar17 * auVar119._16_4_ | (uint)!bVar17 * auVar112._16_4_);
        bVar17 = (bool)((byte)(uVar89 >> 5) & 1);
        auVar131._20_4_ = (float)((uint)bVar17 * auVar119._20_4_ | (uint)!bVar17 * auVar112._20_4_);
        bVar17 = (bool)((byte)(uVar89 >> 6) & 1);
        auVar131._24_4_ = (float)((uint)bVar17 * auVar119._24_4_ | (uint)!bVar17 * auVar112._24_4_);
        bVar17 = SUB81(uVar89 >> 7,0);
        auVar131._28_4_ = (uint)bVar17 * auVar119._28_4_ | (uint)!bVar17 * auVar112._28_4_;
        auVar105 = vxorps_avx512vl(auVar102,auVar102);
        auVar222 = ZEXT1664(auVar105);
        auVar126 = vfmadd213ps_avx512vl(auVar128,auVar128,ZEXT1632(auVar105));
        auVar102 = vfmadd231ps_fma(auVar126,auVar129,auVar129);
        auVar126 = vrsqrt14ps_avx512vl(ZEXT1632(auVar102));
        fVar190 = auVar126._0_4_;
        fVar159 = auVar126._4_4_;
        fVar195 = auVar126._8_4_;
        fVar196 = auVar126._12_4_;
        fVar178 = auVar126._16_4_;
        fVar189 = auVar126._20_4_;
        fVar99 = auVar126._24_4_;
        auVar39._4_4_ = fVar159 * fVar159 * fVar159 * auVar102._4_4_ * -0.5;
        auVar39._0_4_ = fVar190 * fVar190 * fVar190 * auVar102._0_4_ * -0.5;
        auVar39._8_4_ = fVar195 * fVar195 * fVar195 * auVar102._8_4_ * -0.5;
        auVar39._12_4_ = fVar196 * fVar196 * fVar196 * auVar102._12_4_ * -0.5;
        auVar39._16_4_ = fVar178 * fVar178 * fVar178 * -0.0;
        auVar39._20_4_ = fVar189 * fVar189 * fVar189 * -0.0;
        auVar39._24_4_ = fVar99 * fVar99 * fVar99 * -0.0;
        auVar39._28_4_ = 0;
        auVar127 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar125 = vfmadd231ps_avx512vl(auVar39,auVar127,auVar126);
        auVar40._4_4_ = auVar129._4_4_ * auVar125._4_4_;
        auVar40._0_4_ = auVar129._0_4_ * auVar125._0_4_;
        auVar40._8_4_ = auVar129._8_4_ * auVar125._8_4_;
        auVar40._12_4_ = auVar129._12_4_ * auVar125._12_4_;
        auVar40._16_4_ = auVar129._16_4_ * auVar125._16_4_;
        auVar40._20_4_ = auVar129._20_4_ * auVar125._20_4_;
        auVar40._24_4_ = auVar129._24_4_ * auVar125._24_4_;
        auVar40._28_4_ = auVar126._28_4_;
        auVar41._4_4_ = auVar125._4_4_ * -auVar128._4_4_;
        auVar41._0_4_ = auVar125._0_4_ * -auVar128._0_4_;
        auVar41._8_4_ = auVar125._8_4_ * -auVar128._8_4_;
        auVar41._12_4_ = auVar125._12_4_ * -auVar128._12_4_;
        auVar41._16_4_ = auVar125._16_4_ * -auVar128._16_4_;
        auVar41._20_4_ = auVar125._20_4_ * -auVar128._20_4_;
        auVar41._24_4_ = auVar125._24_4_ * -auVar128._24_4_;
        auVar41._28_4_ = auVar128._28_4_ ^ 0x80000000;
        auVar126 = vmulps_avx512vl(auVar125,ZEXT1632(auVar105));
        auVar109 = ZEXT1632(auVar105);
        auVar112 = vfmadd213ps_avx512vl(auVar130,auVar130,auVar109);
        auVar102 = vfmadd231ps_fma(auVar112,auVar131,auVar131);
        auVar112 = vrsqrt14ps_avx512vl(ZEXT1632(auVar102));
        fVar190 = auVar112._0_4_;
        fVar159 = auVar112._4_4_;
        fVar195 = auVar112._8_4_;
        fVar196 = auVar112._12_4_;
        fVar178 = auVar112._16_4_;
        fVar189 = auVar112._20_4_;
        fVar99 = auVar112._24_4_;
        auVar42._4_4_ = fVar159 * fVar159 * fVar159 * auVar102._4_4_ * -0.5;
        auVar42._0_4_ = fVar190 * fVar190 * fVar190 * auVar102._0_4_ * -0.5;
        auVar42._8_4_ = fVar195 * fVar195 * fVar195 * auVar102._8_4_ * -0.5;
        auVar42._12_4_ = fVar196 * fVar196 * fVar196 * auVar102._12_4_ * -0.5;
        auVar42._16_4_ = fVar178 * fVar178 * fVar178 * -0.0;
        auVar42._20_4_ = fVar189 * fVar189 * fVar189 * -0.0;
        auVar42._24_4_ = fVar99 * fVar99 * fVar99 * -0.0;
        auVar42._28_4_ = 0;
        auVar127 = vfmadd231ps_avx512vl(auVar42,auVar127,auVar112);
        auVar43._4_4_ = auVar131._4_4_ * auVar127._4_4_;
        auVar43._0_4_ = auVar131._0_4_ * auVar127._0_4_;
        auVar43._8_4_ = auVar131._8_4_ * auVar127._8_4_;
        auVar43._12_4_ = auVar131._12_4_ * auVar127._12_4_;
        auVar43._16_4_ = auVar131._16_4_ * auVar127._16_4_;
        auVar43._20_4_ = auVar131._20_4_ * auVar127._20_4_;
        auVar43._24_4_ = auVar131._24_4_ * auVar127._24_4_;
        auVar43._28_4_ = auVar112._28_4_;
        auVar44._4_4_ = -auVar130._4_4_ * auVar127._4_4_;
        auVar44._0_4_ = -auVar130._0_4_ * auVar127._0_4_;
        auVar44._8_4_ = -auVar130._8_4_ * auVar127._8_4_;
        auVar44._12_4_ = -auVar130._12_4_ * auVar127._12_4_;
        auVar44._16_4_ = -auVar130._16_4_ * auVar127._16_4_;
        auVar44._20_4_ = -auVar130._20_4_ * auVar127._20_4_;
        auVar44._24_4_ = -auVar130._24_4_ * auVar127._24_4_;
        auVar44._28_4_ = auVar125._28_4_;
        auVar127 = vmulps_avx512vl(auVar127,auVar109);
        auVar102 = vfmadd213ps_fma(auVar40,auVar121,auVar110);
        auVar221 = vfmadd213ps_fma(auVar41,auVar121,auVar117);
        auVar125 = vfmadd213ps_avx512vl(auVar126,auVar121,auVar116);
        auVar112 = vfmadd213ps_avx512vl(auVar43,ZEXT1632(auVar8),auVar118);
        auVar25 = vfnmadd213ps_fma(auVar40,auVar121,auVar110);
        auVar124 = ZEXT1632(auVar8);
        auVar101 = vfmadd213ps_fma(auVar44,auVar124,auVar108);
        auVar104 = vfnmadd213ps_fma(auVar41,auVar121,auVar117);
        auVar9 = vfmadd213ps_fma(auVar127,auVar124,auVar115);
        auVar114 = vfnmadd231ps_avx512vl(auVar116,auVar121,auVar126);
        auVar179 = vfnmadd213ps_fma(auVar43,auVar124,auVar118);
        auVar180 = vfnmadd213ps_fma(auVar44,auVar124,auVar108);
        auVar205 = vfnmadd231ps_fma(auVar115,ZEXT1632(auVar8),auVar127);
        auVar127 = vsubps_avx512vl(auVar112,ZEXT1632(auVar25));
        auVar126 = vsubps_avx(ZEXT1632(auVar101),ZEXT1632(auVar104));
        auVar115 = vsubps_avx512vl(ZEXT1632(auVar9),auVar114);
        auVar116 = vmulps_avx512vl(auVar126,auVar114);
        auVar10 = vfmsub231ps_fma(auVar116,ZEXT1632(auVar104),auVar115);
        auVar45._4_4_ = auVar25._4_4_ * auVar115._4_4_;
        auVar45._0_4_ = auVar25._0_4_ * auVar115._0_4_;
        auVar45._8_4_ = auVar25._8_4_ * auVar115._8_4_;
        auVar45._12_4_ = auVar25._12_4_ * auVar115._12_4_;
        auVar45._16_4_ = auVar115._16_4_ * 0.0;
        auVar45._20_4_ = auVar115._20_4_ * 0.0;
        auVar45._24_4_ = auVar115._24_4_ * 0.0;
        auVar45._28_4_ = auVar115._28_4_;
        auVar115 = vfmsub231ps_avx512vl(auVar45,auVar114,auVar127);
        auVar46._4_4_ = auVar104._4_4_ * auVar127._4_4_;
        auVar46._0_4_ = auVar104._0_4_ * auVar127._0_4_;
        auVar46._8_4_ = auVar104._8_4_ * auVar127._8_4_;
        auVar46._12_4_ = auVar104._12_4_ * auVar127._12_4_;
        auVar46._16_4_ = auVar127._16_4_ * 0.0;
        auVar46._20_4_ = auVar127._20_4_ * 0.0;
        auVar46._24_4_ = auVar127._24_4_ * 0.0;
        auVar46._28_4_ = auVar127._28_4_;
        auVar11 = vfmsub231ps_fma(auVar46,ZEXT1632(auVar25),auVar126);
        auVar126 = vfmadd231ps_avx512vl(ZEXT1632(auVar11),auVar109,auVar115);
        auVar126 = vfmadd231ps_avx512vl(auVar126,auVar109,ZEXT1632(auVar10));
        auVar108 = ZEXT1632(auVar105);
        uVar89 = vcmpps_avx512vl(auVar126,auVar108,2);
        bVar88 = (byte)uVar89;
        fVar99 = (float)((uint)(bVar88 & 1) * auVar102._0_4_ |
                        (uint)!(bool)(bVar88 & 1) * auVar179._0_4_);
        bVar17 = (bool)((byte)(uVar89 >> 1) & 1);
        fVar177 = (float)((uint)bVar17 * auVar102._4_4_ | (uint)!bVar17 * auVar179._4_4_);
        bVar17 = (bool)((byte)(uVar89 >> 2) & 1);
        fVar152 = (float)((uint)bVar17 * auVar102._8_4_ | (uint)!bVar17 * auVar179._8_4_);
        bVar17 = (bool)((byte)(uVar89 >> 3) & 1);
        fVar155 = (float)((uint)bVar17 * auVar102._12_4_ | (uint)!bVar17 * auVar179._12_4_);
        auVar116 = ZEXT1632(CONCAT412(fVar155,CONCAT48(fVar152,CONCAT44(fVar177,fVar99))));
        fVar100 = (float)((uint)(bVar88 & 1) * auVar221._0_4_ |
                         (uint)!(bool)(bVar88 & 1) * auVar180._0_4_);
        bVar17 = (bool)((byte)(uVar89 >> 1) & 1);
        fVar151 = (float)((uint)bVar17 * auVar221._4_4_ | (uint)!bVar17 * auVar180._4_4_);
        bVar17 = (bool)((byte)(uVar89 >> 2) & 1);
        fVar153 = (float)((uint)bVar17 * auVar221._8_4_ | (uint)!bVar17 * auVar180._8_4_);
        bVar17 = (bool)((byte)(uVar89 >> 3) & 1);
        fVar156 = (float)((uint)bVar17 * auVar221._12_4_ | (uint)!bVar17 * auVar180._12_4_);
        auVar124 = ZEXT1632(CONCAT412(fVar156,CONCAT48(fVar153,CONCAT44(fVar151,fVar100))));
        auVar132._0_4_ =
             (float)((uint)(bVar88 & 1) * auVar125._0_4_ |
                    (uint)!(bool)(bVar88 & 1) * auVar205._0_4_);
        bVar17 = (bool)((byte)(uVar89 >> 1) & 1);
        auVar132._4_4_ = (float)((uint)bVar17 * auVar125._4_4_ | (uint)!bVar17 * auVar205._4_4_);
        bVar17 = (bool)((byte)(uVar89 >> 2) & 1);
        auVar132._8_4_ = (float)((uint)bVar17 * auVar125._8_4_ | (uint)!bVar17 * auVar205._8_4_);
        bVar17 = (bool)((byte)(uVar89 >> 3) & 1);
        auVar132._12_4_ = (float)((uint)bVar17 * auVar125._12_4_ | (uint)!bVar17 * auVar205._12_4_);
        fVar190 = (float)((uint)((byte)(uVar89 >> 4) & 1) * auVar125._16_4_);
        auVar132._16_4_ = fVar190;
        fVar159 = (float)((uint)((byte)(uVar89 >> 5) & 1) * auVar125._20_4_);
        auVar132._20_4_ = fVar159;
        fVar195 = (float)((uint)((byte)(uVar89 >> 6) & 1) * auVar125._24_4_);
        auVar132._24_4_ = fVar195;
        iVar1 = (uint)(byte)(uVar89 >> 7) * auVar125._28_4_;
        auVar132._28_4_ = iVar1;
        auVar127 = vblendmps_avx512vl(ZEXT1632(auVar25),auVar112);
        auVar133._0_4_ =
             (uint)(bVar88 & 1) * auVar127._0_4_ | (uint)!(bool)(bVar88 & 1) * auVar10._0_4_;
        bVar17 = (bool)((byte)(uVar89 >> 1) & 1);
        auVar133._4_4_ = (uint)bVar17 * auVar127._4_4_ | (uint)!bVar17 * auVar10._4_4_;
        bVar17 = (bool)((byte)(uVar89 >> 2) & 1);
        auVar133._8_4_ = (uint)bVar17 * auVar127._8_4_ | (uint)!bVar17 * auVar10._8_4_;
        bVar17 = (bool)((byte)(uVar89 >> 3) & 1);
        auVar133._12_4_ = (uint)bVar17 * auVar127._12_4_ | (uint)!bVar17 * auVar10._12_4_;
        auVar133._16_4_ = (uint)((byte)(uVar89 >> 4) & 1) * auVar127._16_4_;
        auVar133._20_4_ = (uint)((byte)(uVar89 >> 5) & 1) * auVar127._20_4_;
        auVar133._24_4_ = (uint)((byte)(uVar89 >> 6) & 1) * auVar127._24_4_;
        auVar133._28_4_ = (uint)(byte)(uVar89 >> 7) * auVar127._28_4_;
        auVar127 = vblendmps_avx512vl(ZEXT1632(auVar104),ZEXT1632(auVar101));
        auVar134._0_4_ =
             (float)((uint)(bVar88 & 1) * auVar127._0_4_ |
                    (uint)!(bool)(bVar88 & 1) * auVar221._0_4_);
        bVar17 = (bool)((byte)(uVar89 >> 1) & 1);
        auVar134._4_4_ = (float)((uint)bVar17 * auVar127._4_4_ | (uint)!bVar17 * auVar221._4_4_);
        bVar17 = (bool)((byte)(uVar89 >> 2) & 1);
        auVar134._8_4_ = (float)((uint)bVar17 * auVar127._8_4_ | (uint)!bVar17 * auVar221._8_4_);
        bVar17 = (bool)((byte)(uVar89 >> 3) & 1);
        auVar134._12_4_ = (float)((uint)bVar17 * auVar127._12_4_ | (uint)!bVar17 * auVar221._12_4_);
        fVar196 = (float)((uint)((byte)(uVar89 >> 4) & 1) * auVar127._16_4_);
        auVar134._16_4_ = fVar196;
        fVar178 = (float)((uint)((byte)(uVar89 >> 5) & 1) * auVar127._20_4_);
        auVar134._20_4_ = fVar178;
        fVar189 = (float)((uint)((byte)(uVar89 >> 6) & 1) * auVar127._24_4_);
        auVar134._24_4_ = fVar189;
        auVar134._28_4_ = (uint)(byte)(uVar89 >> 7) * auVar127._28_4_;
        auVar127 = vblendmps_avx512vl(auVar114,ZEXT1632(auVar9));
        auVar135._0_4_ =
             (float)((uint)(bVar88 & 1) * auVar127._0_4_ |
                    (uint)!(bool)(bVar88 & 1) * auVar125._0_4_);
        bVar17 = (bool)((byte)(uVar89 >> 1) & 1);
        auVar135._4_4_ = (float)((uint)bVar17 * auVar127._4_4_ | (uint)!bVar17 * auVar125._4_4_);
        bVar17 = (bool)((byte)(uVar89 >> 2) & 1);
        auVar135._8_4_ = (float)((uint)bVar17 * auVar127._8_4_ | (uint)!bVar17 * auVar125._8_4_);
        bVar17 = (bool)((byte)(uVar89 >> 3) & 1);
        auVar135._12_4_ = (float)((uint)bVar17 * auVar127._12_4_ | (uint)!bVar17 * auVar125._12_4_);
        bVar17 = (bool)((byte)(uVar89 >> 4) & 1);
        auVar135._16_4_ = (float)((uint)bVar17 * auVar127._16_4_ | (uint)!bVar17 * auVar125._16_4_);
        bVar17 = (bool)((byte)(uVar89 >> 5) & 1);
        auVar135._20_4_ = (float)((uint)bVar17 * auVar127._20_4_ | (uint)!bVar17 * auVar125._20_4_);
        bVar17 = (bool)((byte)(uVar89 >> 6) & 1);
        auVar135._24_4_ = (float)((uint)bVar17 * auVar127._24_4_ | (uint)!bVar17 * auVar125._24_4_);
        bVar17 = SUB81(uVar89 >> 7,0);
        auVar135._28_4_ = (uint)bVar17 * auVar127._28_4_ | (uint)!bVar17 * auVar125._28_4_;
        auVar136._0_4_ =
             (uint)(bVar88 & 1) * (int)auVar25._0_4_ | (uint)!(bool)(bVar88 & 1) * auVar112._0_4_;
        bVar17 = (bool)((byte)(uVar89 >> 1) & 1);
        auVar136._4_4_ = (uint)bVar17 * (int)auVar25._4_4_ | (uint)!bVar17 * auVar112._4_4_;
        bVar17 = (bool)((byte)(uVar89 >> 2) & 1);
        auVar136._8_4_ = (uint)bVar17 * (int)auVar25._8_4_ | (uint)!bVar17 * auVar112._8_4_;
        bVar17 = (bool)((byte)(uVar89 >> 3) & 1);
        auVar136._12_4_ = (uint)bVar17 * (int)auVar25._12_4_ | (uint)!bVar17 * auVar112._12_4_;
        auVar136._16_4_ = (uint)!(bool)((byte)(uVar89 >> 4) & 1) * auVar112._16_4_;
        auVar136._20_4_ = (uint)!(bool)((byte)(uVar89 >> 5) & 1) * auVar112._20_4_;
        auVar136._24_4_ = (uint)!(bool)((byte)(uVar89 >> 6) & 1) * auVar112._24_4_;
        auVar136._28_4_ = (uint)!SUB81(uVar89 >> 7,0) * auVar112._28_4_;
        bVar17 = (bool)((byte)(uVar89 >> 1) & 1);
        bVar19 = (bool)((byte)(uVar89 >> 2) & 1);
        bVar20 = (bool)((byte)(uVar89 >> 3) & 1);
        auVar137._0_4_ =
             (uint)(bVar88 & 1) * auVar114._0_4_ | (uint)!(bool)(bVar88 & 1) * auVar9._0_4_;
        bVar18 = (bool)((byte)(uVar89 >> 1) & 1);
        auVar137._4_4_ = (uint)bVar18 * auVar114._4_4_ | (uint)!bVar18 * auVar9._4_4_;
        bVar18 = (bool)((byte)(uVar89 >> 2) & 1);
        auVar137._8_4_ = (uint)bVar18 * auVar114._8_4_ | (uint)!bVar18 * auVar9._8_4_;
        bVar18 = (bool)((byte)(uVar89 >> 3) & 1);
        auVar137._12_4_ = (uint)bVar18 * auVar114._12_4_ | (uint)!bVar18 * auVar9._12_4_;
        auVar137._16_4_ = (uint)((byte)(uVar89 >> 4) & 1) * auVar114._16_4_;
        auVar137._20_4_ = (uint)((byte)(uVar89 >> 5) & 1) * auVar114._20_4_;
        auVar137._24_4_ = (uint)((byte)(uVar89 >> 6) & 1) * auVar114._24_4_;
        iVar2 = (uint)(byte)(uVar89 >> 7) * auVar114._28_4_;
        auVar137._28_4_ = iVar2;
        auVar110 = vsubps_avx512vl(auVar136,auVar116);
        auVar127 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar20 * (int)auVar104._12_4_ |
                                                 (uint)!bVar20 * auVar101._12_4_,
                                                 CONCAT48((uint)bVar19 * (int)auVar104._8_4_ |
                                                          (uint)!bVar19 * auVar101._8_4_,
                                                          CONCAT44((uint)bVar17 *
                                                                   (int)auVar104._4_4_ |
                                                                   (uint)!bVar17 * auVar101._4_4_,
                                                                   (uint)(bVar88 & 1) *
                                                                   (int)auVar104._0_4_ |
                                                                   (uint)!(bool)(bVar88 & 1) *
                                                                   auVar101._0_4_)))),auVar124);
        auVar125 = vsubps_avx(auVar137,auVar132);
        auVar112 = vsubps_avx(auVar116,auVar133);
        auVar114 = vsubps_avx(auVar124,auVar134);
        auVar115 = vsubps_avx(auVar132,auVar135);
        auVar47._4_4_ = auVar125._4_4_ * fVar177;
        auVar47._0_4_ = auVar125._0_4_ * fVar99;
        auVar47._8_4_ = auVar125._8_4_ * fVar152;
        auVar47._12_4_ = auVar125._12_4_ * fVar155;
        auVar47._16_4_ = auVar125._16_4_ * 0.0;
        auVar47._20_4_ = auVar125._20_4_ * 0.0;
        auVar47._24_4_ = auVar125._24_4_ * 0.0;
        auVar47._28_4_ = iVar2;
        auVar102 = vfmsub231ps_fma(auVar47,auVar132,auVar110);
        auVar48._4_4_ = fVar151 * auVar110._4_4_;
        auVar48._0_4_ = fVar100 * auVar110._0_4_;
        auVar48._8_4_ = fVar153 * auVar110._8_4_;
        auVar48._12_4_ = fVar156 * auVar110._12_4_;
        auVar48._16_4_ = auVar110._16_4_ * 0.0;
        auVar48._20_4_ = auVar110._20_4_ * 0.0;
        auVar48._24_4_ = auVar110._24_4_ * 0.0;
        auVar48._28_4_ = auVar126._28_4_;
        auVar221 = vfmsub231ps_fma(auVar48,auVar116,auVar127);
        auVar126 = vfmadd231ps_avx512vl(ZEXT1632(auVar221),auVar108,ZEXT1632(auVar102));
        auVar191._0_4_ = auVar127._0_4_ * auVar132._0_4_;
        auVar191._4_4_ = auVar127._4_4_ * auVar132._4_4_;
        auVar191._8_4_ = auVar127._8_4_ * auVar132._8_4_;
        auVar191._12_4_ = auVar127._12_4_ * auVar132._12_4_;
        auVar191._16_4_ = auVar127._16_4_ * fVar190;
        auVar191._20_4_ = auVar127._20_4_ * fVar159;
        auVar191._24_4_ = auVar127._24_4_ * fVar195;
        auVar191._28_4_ = 0;
        auVar102 = vfmsub231ps_fma(auVar191,auVar124,auVar125);
        auVar117 = vfmadd231ps_avx512vl(auVar126,auVar108,ZEXT1632(auVar102));
        auVar126 = vmulps_avx512vl(auVar115,auVar133);
        auVar126 = vfmsub231ps_avx512vl(auVar126,auVar112,auVar135);
        auVar49._4_4_ = auVar114._4_4_ * auVar135._4_4_;
        auVar49._0_4_ = auVar114._0_4_ * auVar135._0_4_;
        auVar49._8_4_ = auVar114._8_4_ * auVar135._8_4_;
        auVar49._12_4_ = auVar114._12_4_ * auVar135._12_4_;
        auVar49._16_4_ = auVar114._16_4_ * auVar135._16_4_;
        auVar49._20_4_ = auVar114._20_4_ * auVar135._20_4_;
        auVar49._24_4_ = auVar114._24_4_ * auVar135._24_4_;
        auVar49._28_4_ = auVar135._28_4_;
        auVar102 = vfmsub231ps_fma(auVar49,auVar134,auVar115);
        auVar192._0_4_ = auVar134._0_4_ * auVar112._0_4_;
        auVar192._4_4_ = auVar134._4_4_ * auVar112._4_4_;
        auVar192._8_4_ = auVar134._8_4_ * auVar112._8_4_;
        auVar192._12_4_ = auVar134._12_4_ * auVar112._12_4_;
        auVar192._16_4_ = fVar196 * auVar112._16_4_;
        auVar192._20_4_ = fVar178 * auVar112._20_4_;
        auVar192._24_4_ = fVar189 * auVar112._24_4_;
        auVar192._28_4_ = 0;
        auVar221 = vfmsub231ps_fma(auVar192,auVar114,auVar133);
        auVar126 = vfmadd231ps_avx512vl(ZEXT1632(auVar221),auVar108,auVar126);
        auVar118 = vfmadd231ps_avx512vl(auVar126,auVar108,ZEXT1632(auVar102));
        auVar126 = vmaxps_avx(auVar117,auVar118);
        uVar161 = vcmpps_avx512vl(auVar126,auVar108,2);
        bVar98 = bVar98 & (byte)uVar161;
        in_ZMM20 = ZEXT3264(local_540);
        in_ZMM21 = ZEXT3264(local_560);
        auVar220 = ZEXT3264(local_4a0);
        if (bVar98 == 0) {
          bVar98 = 0;
          auVar204 = ZEXT3264(auVar111);
          auVar188 = ZEXT3264(auVar113);
        }
        else {
          auVar50._4_4_ = auVar115._4_4_ * auVar127._4_4_;
          auVar50._0_4_ = auVar115._0_4_ * auVar127._0_4_;
          auVar50._8_4_ = auVar115._8_4_ * auVar127._8_4_;
          auVar50._12_4_ = auVar115._12_4_ * auVar127._12_4_;
          auVar50._16_4_ = auVar115._16_4_ * auVar127._16_4_;
          auVar50._20_4_ = auVar115._20_4_ * auVar127._20_4_;
          auVar50._24_4_ = auVar115._24_4_ * auVar127._24_4_;
          auVar50._28_4_ = auVar126._28_4_;
          auVar101 = vfmsub231ps_fma(auVar50,auVar114,auVar125);
          auVar51._4_4_ = auVar125._4_4_ * auVar112._4_4_;
          auVar51._0_4_ = auVar125._0_4_ * auVar112._0_4_;
          auVar51._8_4_ = auVar125._8_4_ * auVar112._8_4_;
          auVar51._12_4_ = auVar125._12_4_ * auVar112._12_4_;
          auVar51._16_4_ = auVar125._16_4_ * auVar112._16_4_;
          auVar51._20_4_ = auVar125._20_4_ * auVar112._20_4_;
          auVar51._24_4_ = auVar125._24_4_ * auVar112._24_4_;
          auVar51._28_4_ = auVar125._28_4_;
          auVar221 = vfmsub231ps_fma(auVar51,auVar110,auVar115);
          auVar52._4_4_ = auVar114._4_4_ * auVar110._4_4_;
          auVar52._0_4_ = auVar114._0_4_ * auVar110._0_4_;
          auVar52._8_4_ = auVar114._8_4_ * auVar110._8_4_;
          auVar52._12_4_ = auVar114._12_4_ * auVar110._12_4_;
          auVar52._16_4_ = auVar114._16_4_ * auVar110._16_4_;
          auVar52._20_4_ = auVar114._20_4_ * auVar110._20_4_;
          auVar52._24_4_ = auVar114._24_4_ * auVar110._24_4_;
          auVar52._28_4_ = auVar114._28_4_;
          auVar9 = vfmsub231ps_fma(auVar52,auVar112,auVar127);
          auVar102 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar221),ZEXT1632(auVar9));
          auVar126 = vfmadd231ps_avx512vl(ZEXT1632(auVar102),ZEXT1632(auVar101),auVar108);
          auVar127 = vrcp14ps_avx512vl(auVar126);
          auVar28._8_4_ = 0x3f800000;
          auVar28._0_8_ = &DAT_3f8000003f800000;
          auVar28._12_4_ = 0x3f800000;
          auVar28._16_4_ = 0x3f800000;
          auVar28._20_4_ = 0x3f800000;
          auVar28._24_4_ = 0x3f800000;
          auVar28._28_4_ = 0x3f800000;
          auVar125 = vfnmadd213ps_avx512vl(auVar127,auVar126,auVar28);
          auVar102 = vfmadd132ps_fma(auVar125,auVar127,auVar127);
          auVar53._4_4_ = auVar9._4_4_ * auVar132._4_4_;
          auVar53._0_4_ = auVar9._0_4_ * auVar132._0_4_;
          auVar53._8_4_ = auVar9._8_4_ * auVar132._8_4_;
          auVar53._12_4_ = auVar9._12_4_ * auVar132._12_4_;
          auVar53._16_4_ = fVar190 * 0.0;
          auVar53._20_4_ = fVar159 * 0.0;
          auVar53._24_4_ = fVar195 * 0.0;
          auVar53._28_4_ = iVar1;
          auVar221 = vfmadd231ps_fma(auVar53,auVar124,ZEXT1632(auVar221));
          auVar221 = vfmadd231ps_fma(ZEXT1632(auVar221),auVar116,ZEXT1632(auVar101));
          fVar190 = auVar102._0_4_;
          fVar159 = auVar102._4_4_;
          fVar195 = auVar102._8_4_;
          fVar196 = auVar102._12_4_;
          auVar127 = ZEXT1632(CONCAT412(auVar221._12_4_ * fVar196,
                                        CONCAT48(auVar221._8_4_ * fVar195,
                                                 CONCAT44(auVar221._4_4_ * fVar159,
                                                          auVar221._0_4_ * fVar190))));
          auVar207._4_4_ = uVar93;
          auVar207._0_4_ = uVar93;
          auVar207._8_4_ = uVar93;
          auVar207._12_4_ = uVar93;
          auVar207._16_4_ = uVar93;
          auVar207._20_4_ = uVar93;
          auVar207._24_4_ = uVar93;
          auVar207._28_4_ = uVar93;
          uVar161 = vcmpps_avx512vl(auVar207,auVar127,2);
          uVar160 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar29._4_4_ = uVar160;
          auVar29._0_4_ = uVar160;
          auVar29._8_4_ = uVar160;
          auVar29._12_4_ = uVar160;
          auVar29._16_4_ = uVar160;
          auVar29._20_4_ = uVar160;
          auVar29._24_4_ = uVar160;
          auVar29._28_4_ = uVar160;
          uVar26 = vcmpps_avx512vl(auVar127,auVar29,2);
          bVar98 = (byte)uVar161 & (byte)uVar26 & bVar98;
          if (bVar98 == 0) {
            bVar98 = 0;
            auVar204 = ZEXT3264(auVar111);
            auVar188 = ZEXT3264(auVar113);
          }
          else {
            uVar161 = vcmpps_avx512vl(auVar126,auVar108,4);
            if ((bVar98 & (byte)uVar161) == 0) {
              bVar98 = 0;
              auVar204 = ZEXT3264(auVar111);
              auVar188 = ZEXT3264(auVar113);
            }
            else {
              bVar98 = bVar98 & (byte)uVar161;
              fVar178 = auVar117._0_4_ * fVar190;
              fVar189 = auVar117._4_4_ * fVar159;
              auVar54._4_4_ = fVar189;
              auVar54._0_4_ = fVar178;
              fVar99 = auVar117._8_4_ * fVar195;
              auVar54._8_4_ = fVar99;
              fVar100 = auVar117._12_4_ * fVar196;
              auVar54._12_4_ = fVar100;
              fVar177 = auVar117._16_4_ * 0.0;
              auVar54._16_4_ = fVar177;
              fVar151 = auVar117._20_4_ * 0.0;
              auVar54._20_4_ = fVar151;
              fVar152 = auVar117._24_4_ * 0.0;
              auVar54._24_4_ = fVar152;
              auVar54._28_4_ = auVar117._28_4_;
              fVar190 = auVar118._0_4_ * fVar190;
              fVar159 = auVar118._4_4_ * fVar159;
              auVar55._4_4_ = fVar159;
              auVar55._0_4_ = fVar190;
              fVar195 = auVar118._8_4_ * fVar195;
              auVar55._8_4_ = fVar195;
              fVar196 = auVar118._12_4_ * fVar196;
              auVar55._12_4_ = fVar196;
              fVar153 = auVar118._16_4_ * 0.0;
              auVar55._16_4_ = fVar153;
              fVar155 = auVar118._20_4_ * 0.0;
              auVar55._20_4_ = fVar155;
              fVar156 = auVar118._24_4_ * 0.0;
              auVar55._24_4_ = fVar156;
              auVar55._28_4_ = auVar118._28_4_;
              auVar201._8_4_ = 0x3f800000;
              auVar201._0_8_ = &DAT_3f8000003f800000;
              auVar201._12_4_ = 0x3f800000;
              auVar201._16_4_ = 0x3f800000;
              auVar201._20_4_ = 0x3f800000;
              auVar201._24_4_ = 0x3f800000;
              auVar201._28_4_ = 0x3f800000;
              auVar113 = vsubps_avx(auVar201,auVar54);
              bVar17 = (bool)((byte)(uVar89 >> 1) & 1);
              bVar18 = (bool)((byte)(uVar89 >> 2) & 1);
              bVar19 = (bool)((byte)(uVar89 >> 3) & 1);
              bVar20 = (bool)((byte)(uVar89 >> 4) & 1);
              bVar21 = (bool)((byte)(uVar89 >> 5) & 1);
              bVar22 = (bool)((byte)(uVar89 >> 6) & 1);
              bVar23 = SUB81(uVar89 >> 7,0);
              auVar204 = ZEXT3264(CONCAT428((uint)bVar23 * auVar117._28_4_ |
                                            (uint)!bVar23 * auVar113._28_4_,
                                            CONCAT424((uint)bVar22 * (int)fVar152 |
                                                      (uint)!bVar22 * auVar113._24_4_,
                                                      CONCAT420((uint)bVar21 * (int)fVar151 |
                                                                (uint)!bVar21 * auVar113._20_4_,
                                                                CONCAT416((uint)bVar20 *
                                                                          (int)fVar177 |
                                                                          (uint)!bVar20 *
                                                                          auVar113._16_4_,
                                                                          CONCAT412((uint)bVar19 *
                                                                                    (int)fVar100 |
                                                                                    (uint)!bVar19 *
                                                                                    auVar113._12_4_,
                                                                                    CONCAT48((uint)
                                                  bVar18 * (int)fVar99 |
                                                  (uint)!bVar18 * auVar113._8_4_,
                                                  CONCAT44((uint)bVar17 * (int)fVar189 |
                                                           (uint)!bVar17 * auVar113._4_4_,
                                                           (uint)(bVar88 & 1) * (int)fVar178 |
                                                           (uint)!(bool)(bVar88 & 1) *
                                                           auVar113._0_4_))))))));
              auVar113 = vsubps_avx(auVar201,auVar55);
              bVar17 = (bool)((byte)(uVar89 >> 1) & 1);
              bVar18 = (bool)((byte)(uVar89 >> 2) & 1);
              bVar19 = (bool)((byte)(uVar89 >> 3) & 1);
              bVar20 = (bool)((byte)(uVar89 >> 4) & 1);
              bVar21 = (bool)((byte)(uVar89 >> 5) & 1);
              bVar22 = (bool)((byte)(uVar89 >> 6) & 1);
              bVar23 = SUB81(uVar89 >> 7,0);
              local_220._4_4_ = (uint)bVar17 * (int)fVar159 | (uint)!bVar17 * auVar113._4_4_;
              local_220._0_4_ =
                   (uint)(bVar88 & 1) * (int)fVar190 | (uint)!(bool)(bVar88 & 1) * auVar113._0_4_;
              local_220._8_4_ = (uint)bVar18 * (int)fVar195 | (uint)!bVar18 * auVar113._8_4_;
              local_220._12_4_ = (uint)bVar19 * (int)fVar196 | (uint)!bVar19 * auVar113._12_4_;
              local_220._16_4_ = (uint)bVar20 * (int)fVar153 | (uint)!bVar20 * auVar113._16_4_;
              local_220._20_4_ = (uint)bVar21 * (int)fVar155 | (uint)!bVar21 * auVar113._20_4_;
              local_220._24_4_ = (uint)bVar22 * (int)fVar156 | (uint)!bVar22 * auVar113._24_4_;
              local_220._28_4_ = (uint)bVar23 * auVar118._28_4_ | (uint)!bVar23 * auVar113._28_4_;
              auVar188 = ZEXT3264(auVar127);
            }
          }
        }
        auVar225 = ZEXT3264(local_5a0);
        auVar224 = ZEXT3264(local_580);
        if (bVar98 != 0) {
          auVar113 = vsubps_avx(ZEXT1632(auVar8),auVar121);
          auVar126 = auVar204._0_32_;
          auVar102 = vfmadd213ps_fma(auVar113,auVar126,auVar121);
          uVar160 = *(undefined4 *)((long)local_678->ray_space + k * 4 + -0x10);
          auVar30._4_4_ = uVar160;
          auVar30._0_4_ = uVar160;
          auVar30._8_4_ = uVar160;
          auVar30._12_4_ = uVar160;
          auVar30._16_4_ = uVar160;
          auVar30._20_4_ = uVar160;
          auVar30._24_4_ = uVar160;
          auVar30._28_4_ = uVar160;
          auVar113 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar102._12_4_ + auVar102._12_4_,
                                                        CONCAT48(auVar102._8_4_ + auVar102._8_4_,
                                                                 CONCAT44(auVar102._4_4_ +
                                                                          auVar102._4_4_,
                                                                          auVar102._0_4_ +
                                                                          auVar102._0_4_)))),auVar30
                                    );
          auVar111 = auVar188._0_32_;
          uVar161 = vcmpps_avx512vl(auVar111,auVar113,6);
          bVar98 = bVar98 & (byte)uVar161;
          if (bVar98 != 0) {
            auVar166._8_4_ = 0xbf800000;
            auVar166._0_8_ = 0xbf800000bf800000;
            auVar166._12_4_ = 0xbf800000;
            auVar166._16_4_ = 0xbf800000;
            auVar166._20_4_ = 0xbf800000;
            auVar166._24_4_ = 0xbf800000;
            auVar166._28_4_ = 0xbf800000;
            auVar31._8_4_ = 0x40000000;
            auVar31._0_8_ = 0x4000000040000000;
            auVar31._12_4_ = 0x40000000;
            auVar31._16_4_ = 0x40000000;
            auVar31._20_4_ = 0x40000000;
            auVar31._24_4_ = 0x40000000;
            auVar31._28_4_ = 0x40000000;
            local_3e0 = vfmadd132ps_avx512vl(local_220,auVar166,auVar31);
            local_220 = local_3e0;
            auVar113 = local_220;
            local_3a0 = 0;
            local_220 = auVar113;
            if ((pGVar94->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              fVar190 = 1.0 / auVar212._0_4_;
              local_340[0] = fVar190 * (auVar204._0_4_ + 0.0);
              local_340[1] = fVar190 * (auVar204._4_4_ + 1.0);
              local_340[2] = fVar190 * (auVar204._8_4_ + 2.0);
              local_340[3] = fVar190 * (auVar204._12_4_ + 3.0);
              fStack_330 = fVar190 * (auVar204._16_4_ + 4.0);
              fStack_32c = fVar190 * (auVar204._20_4_ + 5.0);
              fStack_328 = fVar190 * (auVar204._24_4_ + 6.0);
              fStack_324 = auVar204._28_4_ + 7.0;
              local_220._0_8_ = local_3e0._0_8_;
              local_220._8_8_ = local_3e0._8_8_;
              local_220._16_8_ = local_3e0._16_8_;
              local_220._24_8_ = local_3e0._24_8_;
              local_320 = local_220._0_8_;
              uStack_318 = local_220._8_8_;
              uStack_310 = local_220._16_8_;
              uStack_308 = local_220._24_8_;
              local_300 = auVar111;
              auVar167._8_4_ = 0x7f800000;
              auVar167._0_8_ = 0x7f8000007f800000;
              auVar167._12_4_ = 0x7f800000;
              auVar167._16_4_ = 0x7f800000;
              auVar167._20_4_ = 0x7f800000;
              auVar167._24_4_ = 0x7f800000;
              auVar167._28_4_ = 0x7f800000;
              auVar113 = vblendmps_avx512vl(auVar167,auVar111);
              auVar138._0_4_ =
                   (uint)(bVar98 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar98 & 1) * 0x7f800000;
              bVar17 = (bool)(bVar98 >> 1 & 1);
              auVar138._4_4_ = (uint)bVar17 * auVar113._4_4_ | (uint)!bVar17 * 0x7f800000;
              bVar17 = (bool)(bVar98 >> 2 & 1);
              auVar138._8_4_ = (uint)bVar17 * auVar113._8_4_ | (uint)!bVar17 * 0x7f800000;
              bVar17 = (bool)(bVar98 >> 3 & 1);
              auVar138._12_4_ = (uint)bVar17 * auVar113._12_4_ | (uint)!bVar17 * 0x7f800000;
              bVar17 = (bool)(bVar98 >> 4 & 1);
              auVar138._16_4_ = (uint)bVar17 * auVar113._16_4_ | (uint)!bVar17 * 0x7f800000;
              bVar17 = (bool)(bVar98 >> 5 & 1);
              auVar138._20_4_ = (uint)bVar17 * auVar113._20_4_ | (uint)!bVar17 * 0x7f800000;
              bVar17 = (bool)(bVar98 >> 6 & 1);
              auVar138._24_4_ = (uint)bVar17 * auVar113._24_4_ | (uint)!bVar17 * 0x7f800000;
              auVar138._28_4_ =
                   (uint)(bVar98 >> 7) * auVar113._28_4_ | (uint)!(bool)(bVar98 >> 7) * 0x7f800000;
              auVar113 = vshufps_avx(auVar138,auVar138,0xb1);
              auVar113 = vminps_avx(auVar138,auVar113);
              auVar127 = vshufpd_avx(auVar113,auVar113,5);
              auVar113 = vminps_avx(auVar113,auVar127);
              auVar127 = vpermpd_avx2(auVar113,0x4e);
              auVar113 = vminps_avx(auVar113,auVar127);
              uVar161 = vcmpps_avx512vl(auVar138,auVar113,0);
              bVar87 = (byte)uVar161 & bVar98;
              bVar88 = bVar98;
              if (bVar87 != 0) {
                bVar88 = bVar87;
              }
              uVar91 = 0;
              for (uVar90 = (uint)bVar88; (uVar90 & 1) == 0; uVar90 = uVar90 >> 1 | 0x80000000) {
                uVar91 = uVar91 + 1;
              }
              uVar89 = (ulong)uVar91;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar94->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar190 = local_340[uVar89];
                uVar160 = *(undefined4 *)((long)&local_320 + uVar89 * 4);
                fVar195 = 1.0 - fVar190;
                fVar159 = fVar195 * fVar195 * -3.0;
                auVar102 = vfmadd231ss_fma(ZEXT416((uint)(fVar195 * fVar195)),
                                           ZEXT416((uint)(fVar190 * fVar195)),ZEXT416(0xc0000000));
                auVar221 = vfmsub132ss_fma(ZEXT416((uint)(fVar190 * fVar195)),
                                           ZEXT416((uint)(fVar190 * fVar190)),ZEXT416(0x40000000));
                fVar195 = auVar102._0_4_ * 3.0;
                fVar196 = auVar221._0_4_ * 3.0;
                fVar178 = fVar190 * fVar190 * 3.0;
                auVar197._0_4_ = fVar178 * local_620;
                auVar197._4_4_ = fVar178 * fStack_61c;
                auVar197._8_4_ = fVar178 * fStack_618;
                auVar197._12_4_ = fVar178 * fStack_614;
                auVar173._4_4_ = fVar196;
                auVar173._0_4_ = fVar196;
                auVar173._8_4_ = fVar196;
                auVar173._12_4_ = fVar196;
                auVar102 = vfmadd132ps_fma(auVar173,auVar197,*pauVar4);
                auVar204 = ZEXT3264(auVar126);
                auVar181._4_4_ = fVar195;
                auVar181._0_4_ = fVar195;
                auVar181._8_4_ = fVar195;
                auVar181._12_4_ = fVar195;
                auVar102 = vfmadd132ps_fma(auVar181,auVar102,*pauVar3);
                auVar174._4_4_ = fVar159;
                auVar174._0_4_ = fVar159;
                auVar174._8_4_ = fVar159;
                auVar174._12_4_ = fVar159;
                auVar102 = vfmadd213ps_fma(auVar174,auVar24,auVar102);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_300 + uVar89 * 4);
                auVar188 = ZEXT3264(auVar111);
                *(int *)(ray + k * 4 + 0xc0) = auVar102._0_4_;
                uVar15 = vextractps_avx(auVar102,1);
                *(undefined4 *)(ray + k * 4 + 0xd0) = uVar15;
                uVar15 = vextractps_avx(auVar102,2);
                *(undefined4 *)(ray + k * 4 + 0xe0) = uVar15;
                *(float *)(ray + k * 4 + 0xf0) = fVar190;
                *(undefined4 *)(ray + k * 4 + 0x100) = uVar160;
                *(uint *)(ray + k * 4 + 0x110) = uVar13;
                *(uint *)(ray + k * 4 + 0x120) = uVar95;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
              }
              else {
                local_4f0 = vpbroadcastd_avx512vl();
                local_5b0 = vpbroadcastd_avx512vl();
                local_500 = (undefined4)local_660;
                uStack_4fc = (undefined4)((ulong)local_660 >> 0x20);
                local_520 = local_620;
                fStack_51c = fStack_61c;
                fStack_518 = fStack_618;
                fStack_514 = fStack_614;
                local_510 = local_670;
                uStack_508 = uStack_668;
                uStack_4f8 = uStack_658;
                local_400 = auVar126;
                local_3c0 = auVar111;
                local_39c = iVar14;
                local_390 = auVar24;
                local_380 = local_660;
                uStack_378 = uStack_658;
                local_370 = local_670;
                uStack_368 = uStack_668;
                local_350 = bVar98;
                do {
                  auVar221 = auVar222._0_16_;
                  local_4e0._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                  local_2a0 = local_340[uVar89];
                  local_290 = *(undefined4 *)((long)&local_320 + uVar89 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_300 + uVar89 * 4);
                  local_650.context = context->user;
                  fVar159 = 1.0 - local_2a0;
                  fVar190 = fVar159 * fVar159 * -3.0;
                  auVar103 = vfmadd231ss_fma(ZEXT416((uint)(fVar159 * fVar159)),
                                             ZEXT416((uint)(local_2a0 * fVar159)),
                                             ZEXT416(0xc0000000));
                  auVar102 = vfmsub132ss_fma(ZEXT416((uint)(local_2a0 * fVar159)),
                                             ZEXT416((uint)(local_2a0 * local_2a0)),
                                             ZEXT416(0x40000000));
                  fVar159 = auVar103._0_4_ * 3.0;
                  fVar195 = auVar102._0_4_ * 3.0;
                  fVar196 = local_2a0 * local_2a0 * 3.0;
                  auVar200._0_4_ = fVar196 * local_520;
                  auVar200._4_4_ = fVar196 * fStack_51c;
                  auVar200._8_4_ = fVar196 * fStack_518;
                  auVar200._12_4_ = fVar196 * fStack_514;
                  auVar164._4_4_ = fVar195;
                  auVar164._0_4_ = fVar195;
                  auVar164._8_4_ = fVar195;
                  auVar164._12_4_ = fVar195;
                  auVar84._8_8_ = uStack_508;
                  auVar84._0_8_ = local_510;
                  auVar103 = vfmadd132ps_fma(auVar164,auVar200,auVar84);
                  auVar184._4_4_ = fVar159;
                  auVar184._0_4_ = fVar159;
                  auVar184._8_4_ = fVar159;
                  auVar184._12_4_ = fVar159;
                  auVar85._4_4_ = uStack_4fc;
                  auVar85._0_4_ = local_500;
                  auVar85._8_8_ = uStack_4f8;
                  auVar103 = vfmadd132ps_fma(auVar184,auVar103,auVar85);
                  auVar165._4_4_ = fVar190;
                  auVar165._0_4_ = fVar190;
                  auVar165._8_4_ = fVar190;
                  auVar165._12_4_ = fVar190;
                  auVar103 = vfmadd213ps_fma(auVar165,auVar24,auVar103);
                  local_2d0 = auVar103._0_4_;
                  local_2c0 = vshufps_avx(auVar103,auVar103,0x55);
                  local_2b0 = vshufps_avx(auVar103,auVar103,0xaa);
                  iStack_2cc = local_2d0;
                  iStack_2c8 = local_2d0;
                  iStack_2c4 = local_2d0;
                  fStack_29c = local_2a0;
                  fStack_298 = local_2a0;
                  fStack_294 = local_2a0;
                  uStack_28c = local_290;
                  uStack_288 = local_290;
                  uStack_284 = local_290;
                  local_280 = local_5b0._0_8_;
                  uStack_278 = local_5b0._8_8_;
                  local_270 = local_4f0;
                  vpcmpeqd_avx2(ZEXT1632(local_4f0),ZEXT1632(local_4f0));
                  uStack_25c = (local_650.context)->instID[0];
                  local_260 = uStack_25c;
                  uStack_258 = uStack_25c;
                  uStack_254 = uStack_25c;
                  uStack_250 = (local_650.context)->instPrimID[0];
                  uStack_24c = uStack_250;
                  uStack_248 = uStack_250;
                  uStack_244 = uStack_250;
                  local_690 = local_450._0_8_;
                  uStack_688 = local_450._8_8_;
                  local_650.valid = (int *)&local_690;
                  local_650.geometryUserPtr = pGVar94->userPtr;
                  local_650.hit = (RTCHitN *)&local_2d0;
                  local_650.N = 4;
                  local_440 = (uint)uVar89;
                  uStack_43c = (uint)(uVar89 >> 0x20);
                  local_650.ray = (RTCRayN *)ray;
                  if (pGVar94->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar94->intersectionFilterN)(&local_650);
                    uVar89 = CONCAT44(uStack_43c,local_440);
                    auVar223 = ZEXT1664(local_480._0_16_);
                    auVar225 = ZEXT3264(local_5a0);
                    auVar224 = ZEXT3264(local_580);
                    auVar219 = ZEXT3264(local_600);
                    auVar218 = ZEXT3264(local_5e0);
                    auVar220 = ZEXT3264(local_4a0);
                    in_ZMM21 = ZEXT3264(local_560);
                    in_ZMM20 = ZEXT3264(local_540);
                    auVar103 = vxorps_avx512vl(auVar221,auVar221);
                    auVar222 = ZEXT1664(auVar103);
                    uVar93 = local_4c0._0_4_;
                  }
                  auVar103 = auVar222._0_16_;
                  auVar78._8_8_ = uStack_688;
                  auVar78._0_8_ = local_690;
                  uVar92 = vptestmd_avx512vl(auVar78,auVar78);
                  if ((uVar92 & 0xf) == 0) {
LAB_01df83f1:
                    *(undefined4 *)(ray + k * 4 + 0x80) = local_4e0._0_4_;
                  }
                  else {
                    p_Var16 = context->args->filter;
                    if ((p_Var16 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar94->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var16)(&local_650);
                      uVar89 = CONCAT44(uStack_43c,local_440);
                      auVar223 = ZEXT1664(local_480._0_16_);
                      auVar225 = ZEXT3264(local_5a0);
                      auVar224 = ZEXT3264(local_580);
                      auVar219 = ZEXT3264(local_600);
                      auVar218 = ZEXT3264(local_5e0);
                      auVar220 = ZEXT3264(local_4a0);
                      in_ZMM21 = ZEXT3264(local_560);
                      in_ZMM20 = ZEXT3264(local_540);
                      auVar103 = vxorps_avx512vl(auVar103,auVar103);
                      auVar222 = ZEXT1664(auVar103);
                      uVar93 = local_4c0._0_4_;
                    }
                    auVar79._8_8_ = uStack_688;
                    auVar79._0_8_ = local_690;
                    uVar92 = vptestmd_avx512vl(auVar79,auVar79);
                    uVar92 = uVar92 & 0xf;
                    bVar88 = (byte)uVar92;
                    if (bVar88 == 0) goto LAB_01df83f1;
                    iVar1 = *(int *)(local_650.hit + 4);
                    iVar2 = *(int *)(local_650.hit + 8);
                    iVar75 = *(int *)(local_650.hit + 0xc);
                    bVar17 = (bool)((byte)(uVar92 >> 1) & 1);
                    bVar18 = (bool)((byte)(uVar92 >> 2) & 1);
                    bVar19 = SUB81(uVar92 >> 3,0);
                    *(uint *)(local_650.ray + 0xc0) =
                         (uint)(bVar88 & 1) * *(int *)local_650.hit |
                         (uint)!(bool)(bVar88 & 1) * *(int *)(local_650.ray + 0xc0);
                    *(uint *)(local_650.ray + 0xc4) =
                         (uint)bVar17 * iVar1 | (uint)!bVar17 * *(int *)(local_650.ray + 0xc4);
                    *(uint *)(local_650.ray + 200) =
                         (uint)bVar18 * iVar2 | (uint)!bVar18 * *(int *)(local_650.ray + 200);
                    *(uint *)(local_650.ray + 0xcc) =
                         (uint)bVar19 * iVar75 | (uint)!bVar19 * *(int *)(local_650.ray + 0xcc);
                    iVar1 = *(int *)(local_650.hit + 0x14);
                    iVar2 = *(int *)(local_650.hit + 0x18);
                    iVar75 = *(int *)(local_650.hit + 0x1c);
                    bVar17 = (bool)((byte)(uVar92 >> 1) & 1);
                    bVar18 = (bool)((byte)(uVar92 >> 2) & 1);
                    bVar19 = SUB81(uVar92 >> 3,0);
                    *(uint *)(local_650.ray + 0xd0) =
                         (uint)(bVar88 & 1) * *(int *)(local_650.hit + 0x10) |
                         (uint)!(bool)(bVar88 & 1) * *(int *)(local_650.ray + 0xd0);
                    *(uint *)(local_650.ray + 0xd4) =
                         (uint)bVar17 * iVar1 | (uint)!bVar17 * *(int *)(local_650.ray + 0xd4);
                    *(uint *)(local_650.ray + 0xd8) =
                         (uint)bVar18 * iVar2 | (uint)!bVar18 * *(int *)(local_650.ray + 0xd8);
                    *(uint *)(local_650.ray + 0xdc) =
                         (uint)bVar19 * iVar75 | (uint)!bVar19 * *(int *)(local_650.ray + 0xdc);
                    iVar1 = *(int *)(local_650.hit + 0x24);
                    iVar2 = *(int *)(local_650.hit + 0x28);
                    iVar75 = *(int *)(local_650.hit + 0x2c);
                    bVar17 = (bool)((byte)(uVar92 >> 1) & 1);
                    bVar18 = (bool)((byte)(uVar92 >> 2) & 1);
                    bVar19 = SUB81(uVar92 >> 3,0);
                    *(uint *)(local_650.ray + 0xe0) =
                         (uint)(bVar88 & 1) * *(int *)(local_650.hit + 0x20) |
                         (uint)!(bool)(bVar88 & 1) * *(int *)(local_650.ray + 0xe0);
                    *(uint *)(local_650.ray + 0xe4) =
                         (uint)bVar17 * iVar1 | (uint)!bVar17 * *(int *)(local_650.ray + 0xe4);
                    *(uint *)(local_650.ray + 0xe8) =
                         (uint)bVar18 * iVar2 | (uint)!bVar18 * *(int *)(local_650.ray + 0xe8);
                    *(uint *)(local_650.ray + 0xec) =
                         (uint)bVar19 * iVar75 | (uint)!bVar19 * *(int *)(local_650.ray + 0xec);
                    iVar1 = *(int *)(local_650.hit + 0x34);
                    iVar2 = *(int *)(local_650.hit + 0x38);
                    iVar75 = *(int *)(local_650.hit + 0x3c);
                    bVar17 = (bool)((byte)(uVar92 >> 1) & 1);
                    bVar18 = (bool)((byte)(uVar92 >> 2) & 1);
                    bVar19 = SUB81(uVar92 >> 3,0);
                    *(uint *)(local_650.ray + 0xf0) =
                         (uint)(bVar88 & 1) * *(int *)(local_650.hit + 0x30) |
                         (uint)!(bool)(bVar88 & 1) * *(int *)(local_650.ray + 0xf0);
                    *(uint *)(local_650.ray + 0xf4) =
                         (uint)bVar17 * iVar1 | (uint)!bVar17 * *(int *)(local_650.ray + 0xf4);
                    *(uint *)(local_650.ray + 0xf8) =
                         (uint)bVar18 * iVar2 | (uint)!bVar18 * *(int *)(local_650.ray + 0xf8);
                    *(uint *)(local_650.ray + 0xfc) =
                         (uint)bVar19 * iVar75 | (uint)!bVar19 * *(int *)(local_650.ray + 0xfc);
                    auVar103 = *(undefined1 (*) [16])(local_650.ray + 0x100);
                    auVar107._0_4_ =
                         (uint)(bVar88 & 1) * *(int *)(local_650.hit + 0x40) |
                         (uint)!(bool)(bVar88 & 1) * auVar103._0_4_;
                    bVar17 = (bool)((byte)(uVar92 >> 1) & 1);
                    auVar107._4_4_ =
                         (uint)bVar17 * *(int *)(local_650.hit + 0x44) |
                         (uint)!bVar17 * auVar103._4_4_;
                    bVar17 = (bool)((byte)(uVar92 >> 2) & 1);
                    auVar107._8_4_ =
                         (uint)bVar17 * *(int *)(local_650.hit + 0x48) |
                         (uint)!bVar17 * auVar103._8_4_;
                    bVar17 = SUB81(uVar92 >> 3,0);
                    auVar107._12_4_ =
                         (uint)bVar17 * *(int *)(local_650.hit + 0x4c) |
                         (uint)!bVar17 * auVar103._12_4_;
                    *(undefined1 (*) [16])(local_650.ray + 0x100) = auVar107;
                    auVar103 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_650.hit + 0x50));
                    *(undefined1 (*) [16])(local_650.ray + 0x110) = auVar103;
                    auVar103 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_650.hit + 0x60));
                    *(undefined1 (*) [16])(local_650.ray + 0x120) = auVar103;
                    auVar103 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_650.hit + 0x70));
                    *(undefined1 (*) [16])(local_650.ray + 0x130) = auVar103;
                    auVar103 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_650.hit + 0x80));
                    *(undefined1 (*) [16])(local_650.ray + 0x140) = auVar103;
                  }
                  auVar204 = ZEXT3264(auVar126);
                  auVar188 = ZEXT3264(auVar111);
                  auVar103 = auVar223._0_16_;
                  bVar88 = ~(byte)(1 << ((uint)uVar89 & 0x1f)) & bVar98;
                  uVar160 = *(undefined4 *)(ray + k * 4 + 0x80);
                  auVar38._4_4_ = uVar160;
                  auVar38._0_4_ = uVar160;
                  auVar38._8_4_ = uVar160;
                  auVar38._12_4_ = uVar160;
                  auVar38._16_4_ = uVar160;
                  auVar38._20_4_ = uVar160;
                  auVar38._24_4_ = uVar160;
                  auVar38._28_4_ = uVar160;
                  uVar161 = vcmpps_avx512vl(auVar111,auVar38,2);
                  bVar98 = bVar88 & (byte)uVar161;
                  if ((bVar88 & (byte)uVar161) != 0) {
                    auVar172._8_4_ = 0x7f800000;
                    auVar172._0_8_ = 0x7f8000007f800000;
                    auVar172._12_4_ = 0x7f800000;
                    auVar172._16_4_ = 0x7f800000;
                    auVar172._20_4_ = 0x7f800000;
                    auVar172._24_4_ = 0x7f800000;
                    auVar172._28_4_ = 0x7f800000;
                    auVar113 = vblendmps_avx512vl(auVar172,auVar111);
                    auVar150._0_4_ =
                         (uint)(bVar98 & 1) * auVar113._0_4_ |
                         (uint)!(bool)(bVar98 & 1) * 0x7f800000;
                    bVar17 = (bool)(bVar98 >> 1 & 1);
                    auVar150._4_4_ = (uint)bVar17 * auVar113._4_4_ | (uint)!bVar17 * 0x7f800000;
                    bVar17 = (bool)(bVar98 >> 2 & 1);
                    auVar150._8_4_ = (uint)bVar17 * auVar113._8_4_ | (uint)!bVar17 * 0x7f800000;
                    bVar17 = (bool)(bVar98 >> 3 & 1);
                    auVar150._12_4_ = (uint)bVar17 * auVar113._12_4_ | (uint)!bVar17 * 0x7f800000;
                    bVar17 = (bool)(bVar98 >> 4 & 1);
                    auVar150._16_4_ = (uint)bVar17 * auVar113._16_4_ | (uint)!bVar17 * 0x7f800000;
                    bVar17 = (bool)(bVar98 >> 5 & 1);
                    auVar150._20_4_ = (uint)bVar17 * auVar113._20_4_ | (uint)!bVar17 * 0x7f800000;
                    bVar17 = (bool)(bVar98 >> 6 & 1);
                    auVar150._24_4_ = (uint)bVar17 * auVar113._24_4_ | (uint)!bVar17 * 0x7f800000;
                    auVar150._28_4_ =
                         (uint)(bVar98 >> 7) * auVar113._28_4_ |
                         (uint)!(bool)(bVar98 >> 7) * 0x7f800000;
                    auVar113 = vshufps_avx(auVar150,auVar150,0xb1);
                    auVar113 = vminps_avx(auVar150,auVar113);
                    auVar127 = vshufpd_avx(auVar113,auVar113,5);
                    auVar113 = vminps_avx(auVar113,auVar127);
                    auVar127 = vpermpd_avx2(auVar113,0x4e);
                    auVar113 = vminps_avx(auVar113,auVar127);
                    uVar161 = vcmpps_avx512vl(auVar150,auVar113,0);
                    bVar87 = (byte)uVar161 & bVar98;
                    bVar88 = bVar98;
                    if (bVar87 != 0) {
                      bVar88 = bVar87;
                    }
                    uVar91 = 0;
                    for (uVar90 = (uint)bVar88; (uVar90 & 1) == 0; uVar90 = uVar90 >> 1 | 0x80000000
                        ) {
                      uVar91 = uVar91 + 1;
                    }
                    uVar89 = (ulong)uVar91;
                  }
                } while (bVar98 != 0);
              }
            }
          }
        }
      }
      if (8 < iVar14) {
        local_480 = vpbroadcastd_avx512vl();
        local_4c0 = vbroadcastss_avx512vl(auVar103);
        fStack_410 = 1.0 / local_420;
        auStack_41c._0_4_ = fStack_410;
        local_420 = fStack_410;
        auStack_41c._4_4_ = fStack_410;
        fStack_414 = fStack_410;
        local_4e0 = vpbroadcastd_avx512vl();
        local_4f0 = vpbroadcastd_avx512vl();
        lVar97 = 8;
        auVar111 = auVar204._0_32_;
        auVar113 = auVar188._0_32_;
        local_440 = uVar93;
        uStack_43c = uVar93;
        uStack_438 = uVar93;
        uStack_434 = uVar93;
        uStack_430 = uVar93;
        uStack_42c = uVar93;
        uStack_428 = uVar93;
        uStack_424 = uVar93;
        fStack_40c = fStack_410;
        fStack_408 = fStack_410;
        fStack_404 = fStack_410;
        do {
          auVar126 = vpbroadcastd_avx512vl();
          auVar114 = vpor_avx2(auVar126,_DAT_0205a920);
          uVar26 = vpcmpd_avx512vl(auVar114,local_480,1);
          auVar126 = *(undefined1 (*) [32])(bezier_basis0 + lVar97 * 4 + lVar27);
          auVar127 = *(undefined1 (*) [32])(lVar27 + 0x2227768 + lVar97 * 4);
          auVar125 = *(undefined1 (*) [32])(lVar27 + 0x2227bec + lVar97 * 4);
          auVar112 = *(undefined1 (*) [32])(lVar27 + 0x2228070 + lVar97 * 4);
          local_580 = auVar224._0_32_;
          auVar115 = vmulps_avx512vl(local_580,auVar112);
          local_5a0 = auVar225._0_32_;
          auVar116 = vmulps_avx512vl(local_5a0,auVar112);
          auVar56._4_4_ = auVar112._4_4_ * (float)local_140._4_4_;
          auVar56._0_4_ = auVar112._0_4_ * (float)local_140._0_4_;
          auVar56._8_4_ = auVar112._8_4_ * fStack_138;
          auVar56._12_4_ = auVar112._12_4_ * fStack_134;
          auVar56._16_4_ = auVar112._16_4_ * fStack_130;
          auVar56._20_4_ = auVar112._20_4_ * fStack_12c;
          auVar56._24_4_ = auVar112._24_4_ * fStack_128;
          auVar56._28_4_ = auVar114._28_4_;
          auVar114 = vfmadd231ps_avx512vl(auVar115,auVar125,local_e0);
          auVar115 = vfmadd231ps_avx512vl(auVar116,auVar125,local_100);
          auVar116 = vfmadd231ps_avx512vl(auVar56,auVar125,local_120);
          auVar203 = auVar219._0_32_;
          auVar114 = vfmadd231ps_avx512vl(auVar114,auVar127,auVar203);
          auVar115 = vfmadd231ps_avx512vl(auVar115,auVar127,local_1e0);
          auVar103 = vfmadd231ps_fma(auVar116,auVar127,local_c0);
          auVar206 = auVar220._0_32_;
          auVar118 = vfmadd231ps_avx512vl(auVar114,auVar126,auVar206);
          auVar123 = auVar218._0_32_;
          auVar108 = vfmadd231ps_avx512vl(auVar115,auVar126,auVar123);
          auVar114 = *(undefined1 (*) [32])(bezier_basis1 + lVar97 * 4 + lVar27);
          auVar115 = *(undefined1 (*) [32])(lVar27 + 0x2229b88 + lVar97 * 4);
          auVar103 = vfmadd231ps_fma(ZEXT1632(auVar103),auVar126,local_a0);
          auVar116 = *(undefined1 (*) [32])(lVar27 + 0x222a00c + lVar97 * 4);
          auVar124 = *(undefined1 (*) [32])(lVar27 + 0x222a490 + lVar97 * 4);
          auVar110 = vmulps_avx512vl(local_580,auVar124);
          auVar117 = vmulps_avx512vl(local_5a0,auVar124);
          auVar57._4_4_ = auVar124._4_4_ * (float)local_140._4_4_;
          auVar57._0_4_ = auVar124._0_4_ * (float)local_140._0_4_;
          auVar57._8_4_ = auVar124._8_4_ * fStack_138;
          auVar57._12_4_ = auVar124._12_4_ * fStack_134;
          auVar57._16_4_ = auVar124._16_4_ * fStack_130;
          auVar57._20_4_ = auVar124._20_4_ * fStack_12c;
          auVar57._24_4_ = auVar124._24_4_ * fStack_128;
          auVar57._28_4_ = uStack_124;
          auVar110 = vfmadd231ps_avx512vl(auVar110,auVar116,local_e0);
          auVar117 = vfmadd231ps_avx512vl(auVar117,auVar116,local_100);
          auVar109 = vfmadd231ps_avx512vl(auVar57,auVar116,local_120);
          auVar110 = vfmadd231ps_avx512vl(auVar110,auVar115,auVar203);
          auVar117 = vfmadd231ps_avx512vl(auVar117,auVar115,local_1e0);
          auVar102 = vfmadd231ps_fma(auVar109,auVar115,local_c0);
          auVar109 = vfmadd231ps_avx512vl(auVar110,auVar114,auVar206);
          auVar119 = vfmadd231ps_avx512vl(auVar117,auVar114,auVar123);
          auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar114,local_a0);
          auVar120 = vmaxps_avx512vl(ZEXT1632(auVar103),ZEXT1632(auVar102));
          auVar110 = vsubps_avx(auVar109,auVar118);
          auVar117 = vsubps_avx(auVar119,auVar108);
          auVar121 = vmulps_avx512vl(auVar108,auVar110);
          auVar122 = vmulps_avx512vl(auVar118,auVar117);
          auVar121 = vsubps_avx512vl(auVar121,auVar122);
          auVar122 = vmulps_avx512vl(auVar117,auVar117);
          auVar122 = vfmadd231ps_avx512vl(auVar122,auVar110,auVar110);
          auVar120 = vmulps_avx512vl(auVar120,auVar120);
          auVar120 = vmulps_avx512vl(auVar120,auVar122);
          auVar121 = vmulps_avx512vl(auVar121,auVar121);
          uVar161 = vcmpps_avx512vl(auVar121,auVar120,2);
          local_350 = (byte)uVar26 & (byte)uVar161;
          if (local_350 == 0) {
            auVar218 = ZEXT3264(auVar123);
            auVar219 = ZEXT3264(auVar203);
          }
          else {
            auVar124 = vmulps_avx512vl(local_1c0,auVar124);
            auVar116 = vfmadd213ps_avx512vl(auVar116,local_1a0,auVar124);
            auVar115 = vfmadd213ps_avx512vl(auVar115,local_180,auVar116);
            auVar114 = vfmadd213ps_avx512vl(auVar114,local_160,auVar115);
            auVar112 = vmulps_avx512vl(local_1c0,auVar112);
            auVar125 = vfmadd213ps_avx512vl(auVar125,local_1a0,auVar112);
            auVar127 = vfmadd213ps_avx512vl(auVar127,local_180,auVar125);
            auVar115 = vfmadd213ps_avx512vl(auVar126,local_160,auVar127);
            auVar126 = *(undefined1 (*) [32])(lVar27 + 0x22284f4 + lVar97 * 4);
            auVar127 = *(undefined1 (*) [32])(lVar27 + 0x2228978 + lVar97 * 4);
            auVar125 = *(undefined1 (*) [32])(lVar27 + 0x2228dfc + lVar97 * 4);
            auVar112 = *(undefined1 (*) [32])(lVar27 + 0x2229280 + lVar97 * 4);
            auVar116 = vmulps_avx512vl(local_580,auVar112);
            auVar124 = vmulps_avx512vl(local_5a0,auVar112);
            auVar112 = vmulps_avx512vl(local_1c0,auVar112);
            auVar116 = vfmadd231ps_avx512vl(auVar116,auVar125,local_e0);
            auVar124 = vfmadd231ps_avx512vl(auVar124,auVar125,local_100);
            auVar125 = vfmadd231ps_avx512vl(auVar112,local_1a0,auVar125);
            auVar112 = vfmadd231ps_avx512vl(auVar116,auVar127,auVar203);
            auVar116 = vfmadd231ps_avx512vl(auVar124,auVar127,local_1e0);
            auVar127 = vfmadd231ps_avx512vl(auVar125,local_180,auVar127);
            auVar112 = vfmadd231ps_avx512vl(auVar112,auVar126,auVar206);
            auVar116 = vfmadd231ps_avx512vl(auVar116,auVar126,auVar123);
            auVar124 = vfmadd231ps_avx512vl(auVar127,local_160,auVar126);
            auVar126 = *(undefined1 (*) [32])(lVar27 + 0x222a914 + lVar97 * 4);
            auVar127 = *(undefined1 (*) [32])(lVar27 + 0x222b21c + lVar97 * 4);
            auVar125 = *(undefined1 (*) [32])(lVar27 + 0x222b6a0 + lVar97 * 4);
            auVar120 = vmulps_avx512vl(local_580,auVar125);
            auVar121 = vmulps_avx512vl(local_5a0,auVar125);
            auVar125 = vmulps_avx512vl(local_1c0,auVar125);
            auVar120 = vfmadd231ps_avx512vl(auVar120,auVar127,local_e0);
            auVar121 = vfmadd231ps_avx512vl(auVar121,auVar127,local_100);
            auVar125 = vfmadd231ps_avx512vl(auVar125,local_1a0,auVar127);
            auVar127 = *(undefined1 (*) [32])(lVar27 + 0x222ad98 + lVar97 * 4);
            auVar120 = vfmadd231ps_avx512vl(auVar120,auVar127,auVar203);
            auVar221 = vfmadd231ps_fma(auVar121,auVar127,local_1e0);
            auVar127 = vfmadd231ps_avx512vl(auVar125,local_180,auVar127);
            auVar125 = vfmadd231ps_avx512vl(auVar120,auVar126,auVar206);
            auVar120 = vfmadd231ps_avx512vl(ZEXT1632(auVar221),auVar126,auVar123);
            auVar127 = vfmadd231ps_avx512vl(auVar127,local_160,auVar126);
            auVar121 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar112,auVar121);
            vandps_avx512vl(auVar116,auVar121);
            auVar126 = vmaxps_avx(auVar121,auVar121);
            vandps_avx512vl(auVar124,auVar121);
            auVar126 = vmaxps_avx(auVar126,auVar121);
            uVar89 = vcmpps_avx512vl(auVar126,local_4c0,1);
            bVar17 = (bool)((byte)uVar89 & 1);
            auVar139._0_4_ = (float)((uint)bVar17 * auVar110._0_4_ | (uint)!bVar17 * auVar112._0_4_)
            ;
            bVar17 = (bool)((byte)(uVar89 >> 1) & 1);
            auVar139._4_4_ = (float)((uint)bVar17 * auVar110._4_4_ | (uint)!bVar17 * auVar112._4_4_)
            ;
            bVar17 = (bool)((byte)(uVar89 >> 2) & 1);
            auVar139._8_4_ = (float)((uint)bVar17 * auVar110._8_4_ | (uint)!bVar17 * auVar112._8_4_)
            ;
            bVar17 = (bool)((byte)(uVar89 >> 3) & 1);
            auVar139._12_4_ =
                 (float)((uint)bVar17 * auVar110._12_4_ | (uint)!bVar17 * auVar112._12_4_);
            bVar17 = (bool)((byte)(uVar89 >> 4) & 1);
            auVar139._16_4_ =
                 (float)((uint)bVar17 * auVar110._16_4_ | (uint)!bVar17 * auVar112._16_4_);
            bVar17 = (bool)((byte)(uVar89 >> 5) & 1);
            auVar139._20_4_ =
                 (float)((uint)bVar17 * auVar110._20_4_ | (uint)!bVar17 * auVar112._20_4_);
            bVar17 = (bool)((byte)(uVar89 >> 6) & 1);
            auVar139._24_4_ =
                 (float)((uint)bVar17 * auVar110._24_4_ | (uint)!bVar17 * auVar112._24_4_);
            bVar17 = SUB81(uVar89 >> 7,0);
            auVar139._28_4_ = (uint)bVar17 * auVar110._28_4_ | (uint)!bVar17 * auVar112._28_4_;
            bVar17 = (bool)((byte)uVar89 & 1);
            auVar140._0_4_ = (float)((uint)bVar17 * auVar117._0_4_ | (uint)!bVar17 * auVar116._0_4_)
            ;
            bVar17 = (bool)((byte)(uVar89 >> 1) & 1);
            auVar140._4_4_ = (float)((uint)bVar17 * auVar117._4_4_ | (uint)!bVar17 * auVar116._4_4_)
            ;
            bVar17 = (bool)((byte)(uVar89 >> 2) & 1);
            auVar140._8_4_ = (float)((uint)bVar17 * auVar117._8_4_ | (uint)!bVar17 * auVar116._8_4_)
            ;
            bVar17 = (bool)((byte)(uVar89 >> 3) & 1);
            auVar140._12_4_ =
                 (float)((uint)bVar17 * auVar117._12_4_ | (uint)!bVar17 * auVar116._12_4_);
            bVar17 = (bool)((byte)(uVar89 >> 4) & 1);
            auVar140._16_4_ =
                 (float)((uint)bVar17 * auVar117._16_4_ | (uint)!bVar17 * auVar116._16_4_);
            bVar17 = (bool)((byte)(uVar89 >> 5) & 1);
            auVar140._20_4_ =
                 (float)((uint)bVar17 * auVar117._20_4_ | (uint)!bVar17 * auVar116._20_4_);
            bVar17 = (bool)((byte)(uVar89 >> 6) & 1);
            auVar140._24_4_ =
                 (float)((uint)bVar17 * auVar117._24_4_ | (uint)!bVar17 * auVar116._24_4_);
            bVar17 = SUB81(uVar89 >> 7,0);
            auVar140._28_4_ = (uint)bVar17 * auVar117._28_4_ | (uint)!bVar17 * auVar116._28_4_;
            vandps_avx512vl(auVar125,auVar121);
            vandps_avx512vl(auVar120,auVar121);
            auVar126 = vmaxps_avx(auVar140,auVar140);
            vandps_avx512vl(auVar127,auVar121);
            auVar126 = vmaxps_avx(auVar126,auVar140);
            uVar89 = vcmpps_avx512vl(auVar126,local_4c0,1);
            bVar17 = (bool)((byte)uVar89 & 1);
            auVar141._0_4_ = (uint)bVar17 * auVar110._0_4_ | (uint)!bVar17 * auVar125._0_4_;
            bVar17 = (bool)((byte)(uVar89 >> 1) & 1);
            auVar141._4_4_ = (uint)bVar17 * auVar110._4_4_ | (uint)!bVar17 * auVar125._4_4_;
            bVar17 = (bool)((byte)(uVar89 >> 2) & 1);
            auVar141._8_4_ = (uint)bVar17 * auVar110._8_4_ | (uint)!bVar17 * auVar125._8_4_;
            bVar17 = (bool)((byte)(uVar89 >> 3) & 1);
            auVar141._12_4_ = (uint)bVar17 * auVar110._12_4_ | (uint)!bVar17 * auVar125._12_4_;
            bVar17 = (bool)((byte)(uVar89 >> 4) & 1);
            auVar141._16_4_ = (uint)bVar17 * auVar110._16_4_ | (uint)!bVar17 * auVar125._16_4_;
            bVar17 = (bool)((byte)(uVar89 >> 5) & 1);
            auVar141._20_4_ = (uint)bVar17 * auVar110._20_4_ | (uint)!bVar17 * auVar125._20_4_;
            bVar17 = (bool)((byte)(uVar89 >> 6) & 1);
            auVar141._24_4_ = (uint)bVar17 * auVar110._24_4_ | (uint)!bVar17 * auVar125._24_4_;
            bVar17 = SUB81(uVar89 >> 7,0);
            auVar141._28_4_ = (uint)bVar17 * auVar110._28_4_ | (uint)!bVar17 * auVar125._28_4_;
            bVar17 = (bool)((byte)uVar89 & 1);
            auVar142._0_4_ = (float)((uint)bVar17 * auVar117._0_4_ | (uint)!bVar17 * auVar120._0_4_)
            ;
            bVar17 = (bool)((byte)(uVar89 >> 1) & 1);
            auVar142._4_4_ = (float)((uint)bVar17 * auVar117._4_4_ | (uint)!bVar17 * auVar120._4_4_)
            ;
            bVar17 = (bool)((byte)(uVar89 >> 2) & 1);
            auVar142._8_4_ = (float)((uint)bVar17 * auVar117._8_4_ | (uint)!bVar17 * auVar120._8_4_)
            ;
            bVar17 = (bool)((byte)(uVar89 >> 3) & 1);
            auVar142._12_4_ =
                 (float)((uint)bVar17 * auVar117._12_4_ | (uint)!bVar17 * auVar120._12_4_);
            bVar17 = (bool)((byte)(uVar89 >> 4) & 1);
            auVar142._16_4_ =
                 (float)((uint)bVar17 * auVar117._16_4_ | (uint)!bVar17 * auVar120._16_4_);
            bVar17 = (bool)((byte)(uVar89 >> 5) & 1);
            auVar142._20_4_ =
                 (float)((uint)bVar17 * auVar117._20_4_ | (uint)!bVar17 * auVar120._20_4_);
            bVar17 = (bool)((byte)(uVar89 >> 6) & 1);
            auVar142._24_4_ =
                 (float)((uint)bVar17 * auVar117._24_4_ | (uint)!bVar17 * auVar120._24_4_);
            bVar17 = SUB81(uVar89 >> 7,0);
            auVar142._28_4_ = (uint)bVar17 * auVar117._28_4_ | (uint)!bVar17 * auVar120._28_4_;
            auVar209._8_4_ = 0x80000000;
            auVar209._0_8_ = 0x8000000080000000;
            auVar209._12_4_ = 0x80000000;
            auVar209._16_4_ = 0x80000000;
            auVar209._20_4_ = 0x80000000;
            auVar209._24_4_ = 0x80000000;
            auVar209._28_4_ = 0x80000000;
            auVar126 = vxorps_avx512vl(auVar141,auVar209);
            auVar120 = auVar222._0_32_;
            auVar127 = vfmadd213ps_avx512vl(auVar139,auVar139,auVar120);
            auVar221 = vfmadd231ps_fma(auVar127,auVar140,auVar140);
            auVar127 = vrsqrt14ps_avx512vl(ZEXT1632(auVar221));
            auVar217._8_4_ = 0xbf000000;
            auVar217._0_8_ = 0xbf000000bf000000;
            auVar217._12_4_ = 0xbf000000;
            auVar217._16_4_ = 0xbf000000;
            auVar217._20_4_ = 0xbf000000;
            auVar217._24_4_ = 0xbf000000;
            auVar217._28_4_ = 0xbf000000;
            fVar190 = auVar127._0_4_;
            fVar159 = auVar127._4_4_;
            fVar195 = auVar127._8_4_;
            fVar196 = auVar127._12_4_;
            fVar178 = auVar127._16_4_;
            fVar189 = auVar127._20_4_;
            fVar99 = auVar127._24_4_;
            auVar58._4_4_ = fVar159 * fVar159 * fVar159 * auVar221._4_4_ * -0.5;
            auVar58._0_4_ = fVar190 * fVar190 * fVar190 * auVar221._0_4_ * -0.5;
            auVar58._8_4_ = fVar195 * fVar195 * fVar195 * auVar221._8_4_ * -0.5;
            auVar58._12_4_ = fVar196 * fVar196 * fVar196 * auVar221._12_4_ * -0.5;
            auVar58._16_4_ = fVar178 * fVar178 * fVar178 * -0.0;
            auVar58._20_4_ = fVar189 * fVar189 * fVar189 * -0.0;
            auVar58._24_4_ = fVar99 * fVar99 * fVar99 * -0.0;
            auVar58._28_4_ = auVar140._28_4_;
            auVar125 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar127 = vfmadd231ps_avx512vl(auVar58,auVar125,auVar127);
            auVar59._4_4_ = auVar140._4_4_ * auVar127._4_4_;
            auVar59._0_4_ = auVar140._0_4_ * auVar127._0_4_;
            auVar59._8_4_ = auVar140._8_4_ * auVar127._8_4_;
            auVar59._12_4_ = auVar140._12_4_ * auVar127._12_4_;
            auVar59._16_4_ = auVar140._16_4_ * auVar127._16_4_;
            auVar59._20_4_ = auVar140._20_4_ * auVar127._20_4_;
            auVar59._24_4_ = auVar140._24_4_ * auVar127._24_4_;
            auVar59._28_4_ = 0;
            auVar60._4_4_ = auVar127._4_4_ * -auVar139._4_4_;
            auVar60._0_4_ = auVar127._0_4_ * -auVar139._0_4_;
            auVar60._8_4_ = auVar127._8_4_ * -auVar139._8_4_;
            auVar60._12_4_ = auVar127._12_4_ * -auVar139._12_4_;
            auVar60._16_4_ = auVar127._16_4_ * -auVar139._16_4_;
            auVar60._20_4_ = auVar127._20_4_ * -auVar139._20_4_;
            auVar60._24_4_ = auVar127._24_4_ * -auVar139._24_4_;
            auVar60._28_4_ = auVar140._28_4_;
            auVar112 = vmulps_avx512vl(auVar127,auVar120);
            auVar127 = vfmadd213ps_avx512vl(auVar141,auVar141,auVar120);
            auVar127 = vfmadd231ps_avx512vl(auVar127,auVar142,auVar142);
            auVar116 = vrsqrt14ps_avx512vl(auVar127);
            auVar127 = vmulps_avx512vl(auVar127,auVar217);
            fVar190 = auVar116._0_4_;
            fVar159 = auVar116._4_4_;
            fVar195 = auVar116._8_4_;
            fVar196 = auVar116._12_4_;
            fVar178 = auVar116._16_4_;
            fVar189 = auVar116._20_4_;
            fVar99 = auVar116._24_4_;
            auVar61._4_4_ = fVar159 * fVar159 * fVar159 * auVar127._4_4_;
            auVar61._0_4_ = fVar190 * fVar190 * fVar190 * auVar127._0_4_;
            auVar61._8_4_ = fVar195 * fVar195 * fVar195 * auVar127._8_4_;
            auVar61._12_4_ = fVar196 * fVar196 * fVar196 * auVar127._12_4_;
            auVar61._16_4_ = fVar178 * fVar178 * fVar178 * auVar127._16_4_;
            auVar61._20_4_ = fVar189 * fVar189 * fVar189 * auVar127._20_4_;
            auVar61._24_4_ = fVar99 * fVar99 * fVar99 * auVar127._24_4_;
            auVar61._28_4_ = auVar127._28_4_;
            auVar127 = vfmadd231ps_avx512vl(auVar61,auVar125,auVar116);
            auVar62._4_4_ = auVar142._4_4_ * auVar127._4_4_;
            auVar62._0_4_ = auVar142._0_4_ * auVar127._0_4_;
            auVar62._8_4_ = auVar142._8_4_ * auVar127._8_4_;
            auVar62._12_4_ = auVar142._12_4_ * auVar127._12_4_;
            auVar62._16_4_ = auVar142._16_4_ * auVar127._16_4_;
            auVar62._20_4_ = auVar142._20_4_ * auVar127._20_4_;
            auVar62._24_4_ = auVar142._24_4_ * auVar127._24_4_;
            auVar62._28_4_ = auVar116._28_4_;
            auVar63._4_4_ = auVar127._4_4_ * auVar126._4_4_;
            auVar63._0_4_ = auVar127._0_4_ * auVar126._0_4_;
            auVar63._8_4_ = auVar127._8_4_ * auVar126._8_4_;
            auVar63._12_4_ = auVar127._12_4_ * auVar126._12_4_;
            auVar63._16_4_ = auVar127._16_4_ * auVar126._16_4_;
            auVar63._20_4_ = auVar127._20_4_ * auVar126._20_4_;
            auVar63._24_4_ = auVar127._24_4_ * auVar126._24_4_;
            auVar63._28_4_ = auVar126._28_4_;
            auVar126 = vmulps_avx512vl(auVar127,auVar120);
            auVar221 = vfmadd213ps_fma(auVar59,ZEXT1632(auVar103),auVar118);
            auVar127 = ZEXT1632(auVar103);
            auVar8 = vfmadd213ps_fma(auVar60,auVar127,auVar108);
            auVar125 = vfmadd213ps_avx512vl(auVar112,auVar127,auVar115);
            auVar116 = vfmadd213ps_avx512vl(auVar62,ZEXT1632(auVar102),auVar109);
            auVar25 = vfnmadd213ps_fma(auVar59,auVar127,auVar118);
            auVar124 = ZEXT1632(auVar102);
            auVar101 = vfmadd213ps_fma(auVar63,auVar124,auVar119);
            auVar104 = vfnmadd213ps_fma(auVar60,auVar127,auVar108);
            auVar9 = vfmadd213ps_fma(auVar126,auVar124,auVar114);
            auVar108 = ZEXT1632(auVar103);
            auVar205 = vfnmadd231ps_fma(auVar115,auVar108,auVar112);
            auVar179 = vfnmadd213ps_fma(auVar62,auVar124,auVar109);
            auVar180 = vfnmadd213ps_fma(auVar63,auVar124,auVar119);
            auVar105 = vfnmadd231ps_fma(auVar114,ZEXT1632(auVar102),auVar126);
            auVar114 = vsubps_avx512vl(auVar116,ZEXT1632(auVar25));
            auVar126 = vsubps_avx(ZEXT1632(auVar101),ZEXT1632(auVar104));
            auVar127 = vsubps_avx(ZEXT1632(auVar9),ZEXT1632(auVar205));
            auVar64._4_4_ = auVar126._4_4_ * auVar205._4_4_;
            auVar64._0_4_ = auVar126._0_4_ * auVar205._0_4_;
            auVar64._8_4_ = auVar126._8_4_ * auVar205._8_4_;
            auVar64._12_4_ = auVar126._12_4_ * auVar205._12_4_;
            auVar64._16_4_ = auVar126._16_4_ * 0.0;
            auVar64._20_4_ = auVar126._20_4_ * 0.0;
            auVar64._24_4_ = auVar126._24_4_ * 0.0;
            auVar64._28_4_ = auVar112._28_4_;
            auVar103 = vfmsub231ps_fma(auVar64,ZEXT1632(auVar104),auVar127);
            auVar65._4_4_ = auVar127._4_4_ * auVar25._4_4_;
            auVar65._0_4_ = auVar127._0_4_ * auVar25._0_4_;
            auVar65._8_4_ = auVar127._8_4_ * auVar25._8_4_;
            auVar65._12_4_ = auVar127._12_4_ * auVar25._12_4_;
            auVar65._16_4_ = auVar127._16_4_ * 0.0;
            auVar65._20_4_ = auVar127._20_4_ * 0.0;
            auVar65._24_4_ = auVar127._24_4_ * 0.0;
            auVar65._28_4_ = auVar127._28_4_;
            auVar10 = vfmsub231ps_fma(auVar65,ZEXT1632(auVar205),auVar114);
            auVar66._4_4_ = auVar104._4_4_ * auVar114._4_4_;
            auVar66._0_4_ = auVar104._0_4_ * auVar114._0_4_;
            auVar66._8_4_ = auVar104._8_4_ * auVar114._8_4_;
            auVar66._12_4_ = auVar104._12_4_ * auVar114._12_4_;
            auVar66._16_4_ = auVar114._16_4_ * 0.0;
            auVar66._20_4_ = auVar114._20_4_ * 0.0;
            auVar66._24_4_ = auVar114._24_4_ * 0.0;
            auVar66._28_4_ = auVar114._28_4_;
            auVar11 = vfmsub231ps_fma(auVar66,ZEXT1632(auVar25),auVar126);
            auVar126 = vfmadd231ps_avx512vl(ZEXT1632(auVar11),auVar120,ZEXT1632(auVar10));
            auVar126 = vfmadd231ps_avx512vl(auVar126,auVar120,ZEXT1632(auVar103));
            uVar89 = vcmpps_avx512vl(auVar126,auVar120,2);
            bVar98 = (byte)uVar89;
            fVar151 = (float)((uint)(bVar98 & 1) * auVar221._0_4_ |
                             (uint)!(bool)(bVar98 & 1) * auVar179._0_4_);
            bVar17 = (bool)((byte)(uVar89 >> 1) & 1);
            fVar153 = (float)((uint)bVar17 * auVar221._4_4_ | (uint)!bVar17 * auVar179._4_4_);
            bVar17 = (bool)((byte)(uVar89 >> 2) & 1);
            fVar156 = (float)((uint)bVar17 * auVar221._8_4_ | (uint)!bVar17 * auVar179._8_4_);
            bVar17 = (bool)((byte)(uVar89 >> 3) & 1);
            fVar157 = (float)((uint)bVar17 * auVar221._12_4_ | (uint)!bVar17 * auVar179._12_4_);
            auVar124 = ZEXT1632(CONCAT412(fVar157,CONCAT48(fVar156,CONCAT44(fVar153,fVar151))));
            fVar152 = (float)((uint)(bVar98 & 1) * auVar8._0_4_ |
                             (uint)!(bool)(bVar98 & 1) * auVar180._0_4_);
            bVar17 = (bool)((byte)(uVar89 >> 1) & 1);
            fVar155 = (float)((uint)bVar17 * auVar8._4_4_ | (uint)!bVar17 * auVar180._4_4_);
            bVar17 = (bool)((byte)(uVar89 >> 2) & 1);
            fVar154 = (float)((uint)bVar17 * auVar8._8_4_ | (uint)!bVar17 * auVar180._8_4_);
            bVar17 = (bool)((byte)(uVar89 >> 3) & 1);
            fVar158 = (float)((uint)bVar17 * auVar8._12_4_ | (uint)!bVar17 * auVar180._12_4_);
            auVar110 = ZEXT1632(CONCAT412(fVar158,CONCAT48(fVar154,CONCAT44(fVar155,fVar152))));
            auVar143._0_4_ =
                 (float)((uint)(bVar98 & 1) * auVar125._0_4_ |
                        (uint)!(bool)(bVar98 & 1) * auVar105._0_4_);
            bVar17 = (bool)((byte)(uVar89 >> 1) & 1);
            auVar143._4_4_ = (float)((uint)bVar17 * auVar125._4_4_ | (uint)!bVar17 * auVar105._4_4_)
            ;
            bVar17 = (bool)((byte)(uVar89 >> 2) & 1);
            auVar143._8_4_ = (float)((uint)bVar17 * auVar125._8_4_ | (uint)!bVar17 * auVar105._8_4_)
            ;
            bVar17 = (bool)((byte)(uVar89 >> 3) & 1);
            auVar143._12_4_ =
                 (float)((uint)bVar17 * auVar125._12_4_ | (uint)!bVar17 * auVar105._12_4_);
            fVar190 = (float)((uint)((byte)(uVar89 >> 4) & 1) * auVar125._16_4_);
            auVar143._16_4_ = fVar190;
            fVar159 = (float)((uint)((byte)(uVar89 >> 5) & 1) * auVar125._20_4_);
            auVar143._20_4_ = fVar159;
            fVar195 = (float)((uint)((byte)(uVar89 >> 6) & 1) * auVar125._24_4_);
            auVar143._24_4_ = fVar195;
            iVar1 = (uint)(byte)(uVar89 >> 7) * auVar125._28_4_;
            auVar143._28_4_ = iVar1;
            auVar126 = vblendmps_avx512vl(ZEXT1632(auVar25),auVar116);
            auVar144._0_4_ =
                 (uint)(bVar98 & 1) * auVar126._0_4_ | (uint)!(bool)(bVar98 & 1) * auVar103._0_4_;
            bVar17 = (bool)((byte)(uVar89 >> 1) & 1);
            auVar144._4_4_ = (uint)bVar17 * auVar126._4_4_ | (uint)!bVar17 * auVar103._4_4_;
            bVar17 = (bool)((byte)(uVar89 >> 2) & 1);
            auVar144._8_4_ = (uint)bVar17 * auVar126._8_4_ | (uint)!bVar17 * auVar103._8_4_;
            bVar17 = (bool)((byte)(uVar89 >> 3) & 1);
            auVar144._12_4_ = (uint)bVar17 * auVar126._12_4_ | (uint)!bVar17 * auVar103._12_4_;
            auVar144._16_4_ = (uint)((byte)(uVar89 >> 4) & 1) * auVar126._16_4_;
            auVar144._20_4_ = (uint)((byte)(uVar89 >> 5) & 1) * auVar126._20_4_;
            auVar144._24_4_ = (uint)((byte)(uVar89 >> 6) & 1) * auVar126._24_4_;
            auVar144._28_4_ = (uint)(byte)(uVar89 >> 7) * auVar126._28_4_;
            auVar126 = vblendmps_avx512vl(ZEXT1632(auVar104),ZEXT1632(auVar101));
            auVar145._0_4_ =
                 (float)((uint)(bVar98 & 1) * auVar126._0_4_ |
                        (uint)!(bool)(bVar98 & 1) * auVar221._0_4_);
            bVar17 = (bool)((byte)(uVar89 >> 1) & 1);
            auVar145._4_4_ = (float)((uint)bVar17 * auVar126._4_4_ | (uint)!bVar17 * auVar221._4_4_)
            ;
            bVar17 = (bool)((byte)(uVar89 >> 2) & 1);
            auVar145._8_4_ = (float)((uint)bVar17 * auVar126._8_4_ | (uint)!bVar17 * auVar221._8_4_)
            ;
            bVar17 = (bool)((byte)(uVar89 >> 3) & 1);
            auVar145._12_4_ =
                 (float)((uint)bVar17 * auVar126._12_4_ | (uint)!bVar17 * auVar221._12_4_);
            fVar189 = (float)((uint)((byte)(uVar89 >> 4) & 1) * auVar126._16_4_);
            auVar145._16_4_ = fVar189;
            fVar178 = (float)((uint)((byte)(uVar89 >> 5) & 1) * auVar126._20_4_);
            auVar145._20_4_ = fVar178;
            fVar196 = (float)((uint)((byte)(uVar89 >> 6) & 1) * auVar126._24_4_);
            auVar145._24_4_ = fVar196;
            auVar145._28_4_ = (uint)(byte)(uVar89 >> 7) * auVar126._28_4_;
            auVar126 = vblendmps_avx512vl(ZEXT1632(auVar205),ZEXT1632(auVar9));
            auVar146._0_4_ =
                 (float)((uint)(bVar98 & 1) * auVar126._0_4_ |
                        (uint)!(bool)(bVar98 & 1) * auVar8._0_4_);
            bVar17 = (bool)((byte)(uVar89 >> 1) & 1);
            auVar146._4_4_ = (float)((uint)bVar17 * auVar126._4_4_ | (uint)!bVar17 * auVar8._4_4_);
            bVar17 = (bool)((byte)(uVar89 >> 2) & 1);
            auVar146._8_4_ = (float)((uint)bVar17 * auVar126._8_4_ | (uint)!bVar17 * auVar8._8_4_);
            bVar17 = (bool)((byte)(uVar89 >> 3) & 1);
            auVar146._12_4_ =
                 (float)((uint)bVar17 * auVar126._12_4_ | (uint)!bVar17 * auVar8._12_4_);
            fVar177 = (float)((uint)((byte)(uVar89 >> 4) & 1) * auVar126._16_4_);
            auVar146._16_4_ = fVar177;
            fVar100 = (float)((uint)((byte)(uVar89 >> 5) & 1) * auVar126._20_4_);
            auVar146._20_4_ = fVar100;
            fVar99 = (float)((uint)((byte)(uVar89 >> 6) & 1) * auVar126._24_4_);
            auVar146._24_4_ = fVar99;
            iVar2 = (uint)(byte)(uVar89 >> 7) * auVar126._28_4_;
            auVar146._28_4_ = iVar2;
            auVar147._0_4_ =
                 (uint)(bVar98 & 1) * (int)auVar25._0_4_ |
                 (uint)!(bool)(bVar98 & 1) * auVar116._0_4_;
            bVar17 = (bool)((byte)(uVar89 >> 1) & 1);
            auVar147._4_4_ = (uint)bVar17 * (int)auVar25._4_4_ | (uint)!bVar17 * auVar116._4_4_;
            bVar17 = (bool)((byte)(uVar89 >> 2) & 1);
            auVar147._8_4_ = (uint)bVar17 * (int)auVar25._8_4_ | (uint)!bVar17 * auVar116._8_4_;
            bVar17 = (bool)((byte)(uVar89 >> 3) & 1);
            auVar147._12_4_ = (uint)bVar17 * (int)auVar25._12_4_ | (uint)!bVar17 * auVar116._12_4_;
            auVar147._16_4_ = (uint)!(bool)((byte)(uVar89 >> 4) & 1) * auVar116._16_4_;
            auVar147._20_4_ = (uint)!(bool)((byte)(uVar89 >> 5) & 1) * auVar116._20_4_;
            auVar147._24_4_ = (uint)!(bool)((byte)(uVar89 >> 6) & 1) * auVar116._24_4_;
            auVar147._28_4_ = (uint)!SUB81(uVar89 >> 7,0) * auVar116._28_4_;
            bVar17 = (bool)((byte)(uVar89 >> 1) & 1);
            bVar19 = (bool)((byte)(uVar89 >> 2) & 1);
            bVar21 = (bool)((byte)(uVar89 >> 3) & 1);
            bVar18 = (bool)((byte)(uVar89 >> 1) & 1);
            bVar20 = (bool)((byte)(uVar89 >> 2) & 1);
            bVar22 = (bool)((byte)(uVar89 >> 3) & 1);
            auVar116 = vsubps_avx512vl(auVar147,auVar124);
            auVar127 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar21 * (int)auVar104._12_4_ |
                                                     (uint)!bVar21 * auVar101._12_4_,
                                                     CONCAT48((uint)bVar19 * (int)auVar104._8_4_ |
                                                              (uint)!bVar19 * auVar101._8_4_,
                                                              CONCAT44((uint)bVar17 *
                                                                       (int)auVar104._4_4_ |
                                                                       (uint)!bVar17 *
                                                                       auVar101._4_4_,
                                                                       (uint)(bVar98 & 1) *
                                                                       (int)auVar104._0_4_ |
                                                                       (uint)!(bool)(bVar98 & 1) *
                                                                       auVar101._0_4_)))),auVar110);
            auVar125 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar22 * (int)auVar205._12_4_ |
                                                     (uint)!bVar22 * auVar9._12_4_,
                                                     CONCAT48((uint)bVar20 * (int)auVar205._8_4_ |
                                                              (uint)!bVar20 * auVar9._8_4_,
                                                              CONCAT44((uint)bVar18 *
                                                                       (int)auVar205._4_4_ |
                                                                       (uint)!bVar18 * auVar9._4_4_,
                                                                       (uint)(bVar98 & 1) *
                                                                       (int)auVar205._0_4_ |
                                                                       (uint)!(bool)(bVar98 & 1) *
                                                                       auVar9._0_4_)))),auVar143);
            auVar112 = vsubps_avx(auVar124,auVar144);
            auVar114 = vsubps_avx(auVar110,auVar145);
            auVar115 = vsubps_avx(auVar143,auVar146);
            auVar67._4_4_ = auVar125._4_4_ * fVar153;
            auVar67._0_4_ = auVar125._0_4_ * fVar151;
            auVar67._8_4_ = auVar125._8_4_ * fVar156;
            auVar67._12_4_ = auVar125._12_4_ * fVar157;
            auVar67._16_4_ = auVar125._16_4_ * 0.0;
            auVar67._20_4_ = auVar125._20_4_ * 0.0;
            auVar67._24_4_ = auVar125._24_4_ * 0.0;
            auVar67._28_4_ = 0;
            auVar103 = vfmsub231ps_fma(auVar67,auVar143,auVar116);
            auVar187._0_4_ = fVar152 * auVar116._0_4_;
            auVar187._4_4_ = fVar155 * auVar116._4_4_;
            auVar187._8_4_ = fVar154 * auVar116._8_4_;
            auVar187._12_4_ = fVar158 * auVar116._12_4_;
            auVar187._16_4_ = auVar116._16_4_ * 0.0;
            auVar187._20_4_ = auVar116._20_4_ * 0.0;
            auVar187._24_4_ = auVar116._24_4_ * 0.0;
            auVar187._28_4_ = 0;
            auVar221 = vfmsub231ps_fma(auVar187,auVar124,auVar127);
            auVar126 = vfmadd231ps_avx512vl(ZEXT1632(auVar221),auVar120,ZEXT1632(auVar103));
            auVar193._0_4_ = auVar127._0_4_ * auVar143._0_4_;
            auVar193._4_4_ = auVar127._4_4_ * auVar143._4_4_;
            auVar193._8_4_ = auVar127._8_4_ * auVar143._8_4_;
            auVar193._12_4_ = auVar127._12_4_ * auVar143._12_4_;
            auVar193._16_4_ = auVar127._16_4_ * fVar190;
            auVar193._20_4_ = auVar127._20_4_ * fVar159;
            auVar193._24_4_ = auVar127._24_4_ * fVar195;
            auVar193._28_4_ = 0;
            auVar103 = vfmsub231ps_fma(auVar193,auVar110,auVar125);
            auVar117 = vfmadd231ps_avx512vl(auVar126,auVar120,ZEXT1632(auVar103));
            auVar126 = vmulps_avx512vl(auVar115,auVar144);
            auVar126 = vfmsub231ps_avx512vl(auVar126,auVar112,auVar146);
            auVar68._4_4_ = auVar114._4_4_ * auVar146._4_4_;
            auVar68._0_4_ = auVar114._0_4_ * auVar146._0_4_;
            auVar68._8_4_ = auVar114._8_4_ * auVar146._8_4_;
            auVar68._12_4_ = auVar114._12_4_ * auVar146._12_4_;
            auVar68._16_4_ = auVar114._16_4_ * fVar177;
            auVar68._20_4_ = auVar114._20_4_ * fVar100;
            auVar68._24_4_ = auVar114._24_4_ * fVar99;
            auVar68._28_4_ = iVar2;
            auVar103 = vfmsub231ps_fma(auVar68,auVar145,auVar115);
            auVar194._0_4_ = auVar145._0_4_ * auVar112._0_4_;
            auVar194._4_4_ = auVar145._4_4_ * auVar112._4_4_;
            auVar194._8_4_ = auVar145._8_4_ * auVar112._8_4_;
            auVar194._12_4_ = auVar145._12_4_ * auVar112._12_4_;
            auVar194._16_4_ = fVar189 * auVar112._16_4_;
            auVar194._20_4_ = fVar178 * auVar112._20_4_;
            auVar194._24_4_ = fVar196 * auVar112._24_4_;
            auVar194._28_4_ = 0;
            auVar221 = vfmsub231ps_fma(auVar194,auVar114,auVar144);
            auVar126 = vfmadd231ps_avx512vl(ZEXT1632(auVar221),auVar120,auVar126);
            auVar118 = vfmadd231ps_avx512vl(auVar126,auVar120,ZEXT1632(auVar103));
            auVar126 = vmaxps_avx(auVar117,auVar118);
            uVar161 = vcmpps_avx512vl(auVar126,auVar120,2);
            local_350 = local_350 & (byte)uVar161;
            if (local_350 == 0) {
LAB_01df7a89:
              local_350 = 0;
            }
            else {
              auVar69._4_4_ = auVar115._4_4_ * auVar127._4_4_;
              auVar69._0_4_ = auVar115._0_4_ * auVar127._0_4_;
              auVar69._8_4_ = auVar115._8_4_ * auVar127._8_4_;
              auVar69._12_4_ = auVar115._12_4_ * auVar127._12_4_;
              auVar69._16_4_ = auVar115._16_4_ * auVar127._16_4_;
              auVar69._20_4_ = auVar115._20_4_ * auVar127._20_4_;
              auVar69._24_4_ = auVar115._24_4_ * auVar127._24_4_;
              auVar69._28_4_ = auVar126._28_4_;
              auVar8 = vfmsub231ps_fma(auVar69,auVar114,auVar125);
              auVar70._4_4_ = auVar125._4_4_ * auVar112._4_4_;
              auVar70._0_4_ = auVar125._0_4_ * auVar112._0_4_;
              auVar70._8_4_ = auVar125._8_4_ * auVar112._8_4_;
              auVar70._12_4_ = auVar125._12_4_ * auVar112._12_4_;
              auVar70._16_4_ = auVar125._16_4_ * auVar112._16_4_;
              auVar70._20_4_ = auVar125._20_4_ * auVar112._20_4_;
              auVar70._24_4_ = auVar125._24_4_ * auVar112._24_4_;
              auVar70._28_4_ = auVar125._28_4_;
              auVar221 = vfmsub231ps_fma(auVar70,auVar116,auVar115);
              auVar71._4_4_ = auVar114._4_4_ * auVar116._4_4_;
              auVar71._0_4_ = auVar114._0_4_ * auVar116._0_4_;
              auVar71._8_4_ = auVar114._8_4_ * auVar116._8_4_;
              auVar71._12_4_ = auVar114._12_4_ * auVar116._12_4_;
              auVar71._16_4_ = auVar114._16_4_ * auVar116._16_4_;
              auVar71._20_4_ = auVar114._20_4_ * auVar116._20_4_;
              auVar71._24_4_ = auVar114._24_4_ * auVar116._24_4_;
              auVar71._28_4_ = auVar114._28_4_;
              auVar101 = vfmsub231ps_fma(auVar71,auVar112,auVar127);
              auVar103 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar221),ZEXT1632(auVar101));
              auVar126 = vfmadd231ps_avx512vl(ZEXT1632(auVar103),ZEXT1632(auVar8),auVar120);
              auVar127 = vrcp14ps_avx512vl(auVar126);
              auVar33._8_4_ = 0x3f800000;
              auVar33._0_8_ = &DAT_3f8000003f800000;
              auVar33._12_4_ = 0x3f800000;
              auVar33._16_4_ = 0x3f800000;
              auVar33._20_4_ = 0x3f800000;
              auVar33._24_4_ = 0x3f800000;
              auVar33._28_4_ = 0x3f800000;
              auVar125 = vfnmadd213ps_avx512vl(auVar127,auVar126,auVar33);
              auVar103 = vfmadd132ps_fma(auVar125,auVar127,auVar127);
              auVar72._4_4_ = auVar101._4_4_ * auVar143._4_4_;
              auVar72._0_4_ = auVar101._0_4_ * auVar143._0_4_;
              auVar72._8_4_ = auVar101._8_4_ * auVar143._8_4_;
              auVar72._12_4_ = auVar101._12_4_ * auVar143._12_4_;
              auVar72._16_4_ = fVar190 * 0.0;
              auVar72._20_4_ = fVar159 * 0.0;
              auVar72._24_4_ = fVar195 * 0.0;
              auVar72._28_4_ = iVar1;
              auVar221 = vfmadd231ps_fma(auVar72,auVar110,ZEXT1632(auVar221));
              auVar221 = vfmadd231ps_fma(ZEXT1632(auVar221),auVar124,ZEXT1632(auVar8));
              fVar190 = auVar103._0_4_;
              fVar159 = auVar103._4_4_;
              fVar195 = auVar103._8_4_;
              fVar196 = auVar103._12_4_;
              auVar127 = ZEXT1632(CONCAT412(auVar221._12_4_ * fVar196,
                                            CONCAT48(auVar221._8_4_ * fVar195,
                                                     CONCAT44(auVar221._4_4_ * fVar159,
                                                              auVar221._0_4_ * fVar190))));
              auVar86._4_4_ = uStack_43c;
              auVar86._0_4_ = local_440;
              auVar86._8_4_ = uStack_438;
              auVar86._12_4_ = uStack_434;
              auVar86._16_4_ = uStack_430;
              auVar86._20_4_ = uStack_42c;
              auVar86._24_4_ = uStack_428;
              auVar86._28_4_ = uStack_424;
              uVar161 = vcmpps_avx512vl(auVar127,auVar86,0xd);
              uVar160 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar34._4_4_ = uVar160;
              auVar34._0_4_ = uVar160;
              auVar34._8_4_ = uVar160;
              auVar34._12_4_ = uVar160;
              auVar34._16_4_ = uVar160;
              auVar34._20_4_ = uVar160;
              auVar34._24_4_ = uVar160;
              auVar34._28_4_ = uVar160;
              uVar26 = vcmpps_avx512vl(auVar127,auVar34,2);
              local_350 = (byte)uVar161 & (byte)uVar26 & local_350;
              if (local_350 == 0) goto LAB_01df7a89;
              uVar161 = vcmpps_avx512vl(auVar126,auVar120,4);
              if ((local_350 & (byte)uVar161) == 0) {
                local_350 = 0;
              }
              else {
                local_350 = local_350 & (byte)uVar161;
                fVar178 = auVar117._0_4_ * fVar190;
                fVar189 = auVar117._4_4_ * fVar159;
                auVar73._4_4_ = fVar189;
                auVar73._0_4_ = fVar178;
                fVar99 = auVar117._8_4_ * fVar195;
                auVar73._8_4_ = fVar99;
                fVar100 = auVar117._12_4_ * fVar196;
                auVar73._12_4_ = fVar100;
                fVar177 = auVar117._16_4_ * 0.0;
                auVar73._16_4_ = fVar177;
                fVar151 = auVar117._20_4_ * 0.0;
                auVar73._20_4_ = fVar151;
                fVar152 = auVar117._24_4_ * 0.0;
                auVar73._24_4_ = fVar152;
                auVar73._28_4_ = auVar117._28_4_;
                fVar190 = auVar118._0_4_ * fVar190;
                fVar159 = auVar118._4_4_ * fVar159;
                auVar74._4_4_ = fVar159;
                auVar74._0_4_ = fVar190;
                fVar195 = auVar118._8_4_ * fVar195;
                auVar74._8_4_ = fVar195;
                fVar196 = auVar118._12_4_ * fVar196;
                auVar74._12_4_ = fVar196;
                fVar153 = auVar118._16_4_ * 0.0;
                auVar74._16_4_ = fVar153;
                fVar155 = auVar118._20_4_ * 0.0;
                auVar74._20_4_ = fVar155;
                fVar156 = auVar118._24_4_ * 0.0;
                auVar74._24_4_ = fVar156;
                auVar74._28_4_ = auVar118._28_4_;
                auVar202._8_4_ = 0x3f800000;
                auVar202._0_8_ = &DAT_3f8000003f800000;
                auVar202._12_4_ = 0x3f800000;
                auVar202._16_4_ = 0x3f800000;
                auVar202._20_4_ = 0x3f800000;
                auVar202._24_4_ = 0x3f800000;
                auVar202._28_4_ = 0x3f800000;
                auVar126 = vsubps_avx512vl(auVar202,auVar73);
                bVar17 = (bool)((byte)(uVar89 >> 1) & 1);
                bVar18 = (bool)((byte)(uVar89 >> 2) & 1);
                bVar19 = (bool)((byte)(uVar89 >> 3) & 1);
                bVar20 = (bool)((byte)(uVar89 >> 4) & 1);
                bVar21 = (bool)((byte)(uVar89 >> 5) & 1);
                bVar22 = (bool)((byte)(uVar89 >> 6) & 1);
                bVar23 = SUB81(uVar89 >> 7,0);
                in_ZMM20 = ZEXT3264(CONCAT428((uint)bVar23 * auVar117._28_4_ |
                                              (uint)!bVar23 * auVar126._28_4_,
                                              CONCAT424((uint)bVar22 * (int)fVar152 |
                                                        (uint)!bVar22 * auVar126._24_4_,
                                                        CONCAT420((uint)bVar21 * (int)fVar151 |
                                                                  (uint)!bVar21 * auVar126._20_4_,
                                                                  CONCAT416((uint)bVar20 *
                                                                            (int)fVar177 |
                                                                            (uint)!bVar20 *
                                                                            auVar126._16_4_,
                                                                            CONCAT412((uint)bVar19 *
                                                                                      (int)fVar100 |
                                                                                      (uint)!bVar19
                                                                                      * auVar126.
                                                  _12_4_,CONCAT48((uint)bVar18 * (int)fVar99 |
                                                                  (uint)!bVar18 * auVar126._8_4_,
                                                                  CONCAT44((uint)bVar17 *
                                                                           (int)fVar189 |
                                                                           (uint)!bVar17 *
                                                                           auVar126._4_4_,
                                                                           (uint)(bVar98 & 1) *
                                                                           (int)fVar178 |
                                                                           (uint)!(bool)(bVar98 & 1)
                                                                           * auVar126._0_4_))))))));
                auVar126 = vsubps_avx(auVar202,auVar74);
                bVar17 = (bool)((byte)(uVar89 >> 1) & 1);
                bVar18 = (bool)((byte)(uVar89 >> 2) & 1);
                bVar19 = (bool)((byte)(uVar89 >> 3) & 1);
                bVar20 = (bool)((byte)(uVar89 >> 4) & 1);
                bVar21 = (bool)((byte)(uVar89 >> 5) & 1);
                bVar22 = (bool)((byte)(uVar89 >> 6) & 1);
                bVar23 = SUB81(uVar89 >> 7,0);
                local_240._4_4_ = (uint)bVar17 * (int)fVar159 | (uint)!bVar17 * auVar126._4_4_;
                local_240._0_4_ =
                     (uint)(bVar98 & 1) * (int)fVar190 | (uint)!(bool)(bVar98 & 1) * auVar126._0_4_;
                local_240._8_4_ = (uint)bVar18 * (int)fVar195 | (uint)!bVar18 * auVar126._8_4_;
                local_240._12_4_ = (uint)bVar19 * (int)fVar196 | (uint)!bVar19 * auVar126._12_4_;
                local_240._16_4_ = (uint)bVar20 * (int)fVar153 | (uint)!bVar20 * auVar126._16_4_;
                local_240._20_4_ = (uint)bVar21 * (int)fVar155 | (uint)!bVar21 * auVar126._20_4_;
                local_240._24_4_ = (uint)bVar22 * (int)fVar156 | (uint)!bVar22 * auVar126._24_4_;
                local_240._28_4_ = (uint)bVar23 * auVar118._28_4_ | (uint)!bVar23 * auVar126._28_4_;
                in_ZMM21 = ZEXT3264(auVar127);
              }
            }
            auVar219 = ZEXT3264(local_600);
            auVar218 = ZEXT3264(local_5e0);
            if (local_350 != 0) {
              auVar126 = vsubps_avx(ZEXT1632(auVar102),auVar108);
              local_540 = in_ZMM20._0_32_;
              auVar126 = vfmadd213ps_avx512vl(auVar126,local_540,auVar108);
              auVar168._0_4_ = auVar126._0_4_ + auVar126._0_4_;
              auVar168._4_4_ = auVar126._4_4_ + auVar126._4_4_;
              auVar168._8_4_ = auVar126._8_4_ + auVar126._8_4_;
              auVar168._12_4_ = auVar126._12_4_ + auVar126._12_4_;
              auVar168._16_4_ = auVar126._16_4_ + auVar126._16_4_;
              auVar168._20_4_ = auVar126._20_4_ + auVar126._20_4_;
              auVar168._24_4_ = auVar126._24_4_ + auVar126._24_4_;
              auVar168._28_4_ = auVar126._28_4_ + auVar126._28_4_;
              uVar160 = *(undefined4 *)((long)local_678->ray_space + k * 4 + -0x10);
              auVar35._4_4_ = uVar160;
              auVar35._0_4_ = uVar160;
              auVar35._8_4_ = uVar160;
              auVar35._12_4_ = uVar160;
              auVar35._16_4_ = uVar160;
              auVar35._20_4_ = uVar160;
              auVar35._24_4_ = uVar160;
              auVar35._28_4_ = uVar160;
              auVar126 = vmulps_avx512vl(auVar168,auVar35);
              local_560 = in_ZMM21._0_32_;
              uVar161 = vcmpps_avx512vl(local_560,auVar126,6);
              local_350 = local_350 & (byte)uVar161;
              uVar93 = (uint)local_350;
              if (local_350 != 0) {
                auVar169._8_4_ = 0xbf800000;
                auVar169._0_8_ = 0xbf800000bf800000;
                auVar169._12_4_ = 0xbf800000;
                auVar169._16_4_ = 0xbf800000;
                auVar169._20_4_ = 0xbf800000;
                auVar169._24_4_ = 0xbf800000;
                auVar169._28_4_ = 0xbf800000;
                auVar36._8_4_ = 0x40000000;
                auVar36._0_8_ = 0x4000000040000000;
                auVar36._12_4_ = 0x40000000;
                auVar36._16_4_ = 0x40000000;
                auVar36._20_4_ = 0x40000000;
                auVar36._24_4_ = 0x40000000;
                auVar36._28_4_ = 0x40000000;
                local_3e0 = vfmadd132ps_avx512vl(local_240,auVar169,auVar36);
                local_240 = local_3e0;
                auVar126 = local_240;
                local_3a0 = (undefined4)lVar97;
                local_380 = local_660;
                uStack_378 = uStack_658;
                local_370 = local_670;
                uStack_368 = uStack_668;
                local_360 = CONCAT44(fStack_61c,local_620);
                uStack_358 = CONCAT44(fStack_614,fStack_618);
                pGVar94 = (context->scene->geometries).items[uVar95].ptr;
                local_240 = auVar126;
                if ((pGVar94->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  auVar126 = vaddps_avx512vl(local_540,_DAT_02020f40);
                  auVar103 = vcvtsi2ss_avx512f(auVar220._0_16_,local_3a0);
                  fVar190 = auVar103._0_4_;
                  local_340[0] = (fVar190 + auVar126._0_4_) * local_420;
                  local_340[1] = (fVar190 + auVar126._4_4_) * (float)auStack_41c._0_4_;
                  local_340[2] = (fVar190 + auVar126._8_4_) * (float)auStack_41c._4_4_;
                  local_340[3] = (fVar190 + auVar126._12_4_) * fStack_414;
                  fStack_330 = (fVar190 + auVar126._16_4_) * fStack_410;
                  fStack_32c = (fVar190 + auVar126._20_4_) * fStack_40c;
                  fStack_328 = (fVar190 + auVar126._24_4_) * fStack_408;
                  fStack_324 = fVar190 + auVar126._28_4_;
                  local_240._0_8_ = local_3e0._0_8_;
                  local_240._8_8_ = local_3e0._8_8_;
                  local_240._16_8_ = local_3e0._16_8_;
                  local_240._24_8_ = local_3e0._24_8_;
                  local_320 = local_240._0_8_;
                  uStack_318 = local_240._8_8_;
                  uStack_310 = local_240._16_8_;
                  uStack_308 = local_240._24_8_;
                  local_300 = local_560;
                  auVar170._8_4_ = 0x7f800000;
                  auVar170._0_8_ = 0x7f8000007f800000;
                  auVar170._12_4_ = 0x7f800000;
                  auVar170._16_4_ = 0x7f800000;
                  auVar170._20_4_ = 0x7f800000;
                  auVar170._24_4_ = 0x7f800000;
                  auVar170._28_4_ = 0x7f800000;
                  auVar126 = vblendmps_avx512vl(auVar170,local_560);
                  auVar148._0_4_ =
                       (uint)(local_350 & 1) * auVar126._0_4_ |
                       (uint)!(bool)(local_350 & 1) * 0x7f800000;
                  bVar17 = (bool)(local_350 >> 1 & 1);
                  auVar148._4_4_ = (uint)bVar17 * auVar126._4_4_ | (uint)!bVar17 * 0x7f800000;
                  bVar17 = (bool)(local_350 >> 2 & 1);
                  auVar148._8_4_ = (uint)bVar17 * auVar126._8_4_ | (uint)!bVar17 * 0x7f800000;
                  bVar17 = (bool)(local_350 >> 3 & 1);
                  auVar148._12_4_ = (uint)bVar17 * auVar126._12_4_ | (uint)!bVar17 * 0x7f800000;
                  bVar17 = (bool)(local_350 >> 4 & 1);
                  auVar148._16_4_ = (uint)bVar17 * auVar126._16_4_ | (uint)!bVar17 * 0x7f800000;
                  bVar17 = (bool)(local_350 >> 5 & 1);
                  auVar148._20_4_ = (uint)bVar17 * auVar126._20_4_ | (uint)!bVar17 * 0x7f800000;
                  bVar17 = (bool)(local_350 >> 6 & 1);
                  auVar148._24_4_ = (uint)bVar17 * auVar126._24_4_ | (uint)!bVar17 * 0x7f800000;
                  auVar148._28_4_ =
                       (uint)(local_350 >> 7) * auVar126._28_4_ |
                       (uint)!(bool)(local_350 >> 7) * 0x7f800000;
                  auVar126 = vshufps_avx(auVar148,auVar148,0xb1);
                  auVar126 = vminps_avx(auVar148,auVar126);
                  auVar127 = vshufpd_avx(auVar126,auVar126,5);
                  auVar126 = vminps_avx(auVar126,auVar127);
                  auVar127 = vpermpd_avx2(auVar126,0x4e);
                  auVar126 = vminps_avx(auVar126,auVar127);
                  uVar161 = vcmpps_avx512vl(auVar148,auVar126,0);
                  bVar88 = (byte)uVar161 & local_350;
                  bVar98 = local_350;
                  if (bVar88 != 0) {
                    bVar98 = bVar88;
                  }
                  uVar91 = 0;
                  for (uVar90 = (uint)bVar98; (uVar90 & 1) == 0; uVar90 = uVar90 >> 1 | 0x80000000)
                  {
                    uVar91 = uVar91 + 1;
                  }
                  uVar89 = (ulong)uVar91;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar94->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar190 = local_340[uVar89];
                    uVar160 = *(undefined4 *)((long)&local_320 + uVar89 * 4);
                    fVar195 = 1.0 - fVar190;
                    fVar159 = fVar195 * fVar195 * -3.0;
                    auVar103 = vfmadd231ss_fma(ZEXT416((uint)(fVar195 * fVar195)),
                                               ZEXT416((uint)(fVar190 * fVar195)),
                                               ZEXT416(0xc0000000));
                    auVar102 = vfmsub132ss_fma(ZEXT416((uint)(fVar190 * fVar195)),
                                               ZEXT416((uint)(fVar190 * fVar190)),
                                               ZEXT416(0x40000000));
                    fVar195 = auVar103._0_4_ * 3.0;
                    fVar196 = auVar102._0_4_ * 3.0;
                    fVar178 = fVar190 * fVar190 * 3.0;
                    auVar198._0_4_ = fVar178 * local_620;
                    auVar198._4_4_ = fVar178 * fStack_61c;
                    auVar198._8_4_ = fVar178 * fStack_618;
                    auVar198._12_4_ = fVar178 * fStack_614;
                    auVar175._4_4_ = fVar196;
                    auVar175._0_4_ = fVar196;
                    auVar175._8_4_ = fVar196;
                    auVar175._12_4_ = fVar196;
                    auVar80._8_8_ = uStack_668;
                    auVar80._0_8_ = local_670;
                    auVar103 = vfmadd132ps_fma(auVar175,auVar198,auVar80);
                    auVar182._4_4_ = fVar195;
                    auVar182._0_4_ = fVar195;
                    auVar182._8_4_ = fVar195;
                    auVar182._12_4_ = fVar195;
                    auVar81._8_8_ = uStack_658;
                    auVar81._0_8_ = local_660;
                    auVar103 = vfmadd132ps_fma(auVar182,auVar103,auVar81);
                    auVar176._4_4_ = fVar159;
                    auVar176._0_4_ = fVar159;
                    auVar176._8_4_ = fVar159;
                    auVar176._12_4_ = fVar159;
                    auVar103 = vfmadd213ps_fma(auVar176,auVar24,auVar103);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_300 + uVar89 * 4);
                    *(int *)(ray + k * 4 + 0xc0) = auVar103._0_4_;
                    uVar15 = vextractps_avx(auVar103,1);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar15;
                    uVar15 = vextractps_avx(auVar103,2);
                    *(undefined4 *)(ray + k * 4 + 0xe0) = uVar15;
                    *(float *)(ray + k * 4 + 0xf0) = fVar190;
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar160;
                    *(uint *)(ray + k * 4 + 0x110) = uVar13;
                    *(uint *)(ray + k * 4 + 0x120) = uVar95;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  }
                  else {
                    local_510 = local_660;
                    uStack_508 = uStack_658;
                    local_520 = (float)local_670;
                    fStack_51c = (float)((ulong)local_670 >> 0x20);
                    fStack_518 = (float)uStack_668;
                    fStack_514 = (float)((ulong)uStack_668 >> 0x20);
                    local_1f0 = local_360;
                    uStack_1e8 = uStack_358;
                    local_608 = pGVar94;
                    local_400 = local_540;
                    local_3c0 = local_560;
                    local_39c = iVar14;
                    local_390 = auVar24;
                    do {
                      auVar221 = auVar222._0_16_;
                      local_500 = *(undefined4 *)(ray + k * 4 + 0x80);
                      local_2a0 = local_340[uVar89];
                      local_290 = *(undefined4 *)((long)&local_320 + uVar89 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_300 + uVar89 * 4);
                      local_650.context = context->user;
                      fVar159 = 1.0 - local_2a0;
                      fVar190 = fVar159 * fVar159 * -3.0;
                      auVar103 = vfmadd231ss_fma(ZEXT416((uint)(fVar159 * fVar159)),
                                                 ZEXT416((uint)(local_2a0 * fVar159)),
                                                 ZEXT416(0xc0000000));
                      auVar102 = vfmsub132ss_fma(ZEXT416((uint)(local_2a0 * fVar159)),
                                                 ZEXT416((uint)(local_2a0 * local_2a0)),
                                                 ZEXT416(0x40000000));
                      fVar159 = auVar103._0_4_ * 3.0;
                      fVar195 = auVar102._0_4_ * 3.0;
                      fVar196 = local_2a0 * local_2a0 * 3.0;
                      auVar199._0_4_ = fVar196 * (float)local_1f0;
                      auVar199._4_4_ = fVar196 * local_1f0._4_4_;
                      auVar199._8_4_ = fVar196 * (float)uStack_1e8;
                      auVar199._12_4_ = fVar196 * uStack_1e8._4_4_;
                      auVar162._4_4_ = fVar195;
                      auVar162._0_4_ = fVar195;
                      auVar162._8_4_ = fVar195;
                      auVar162._12_4_ = fVar195;
                      auVar82._4_4_ = fStack_51c;
                      auVar82._0_4_ = local_520;
                      auVar82._8_4_ = fStack_518;
                      auVar82._12_4_ = fStack_514;
                      auVar103 = vfmadd132ps_fma(auVar162,auVar199,auVar82);
                      auVar183._4_4_ = fVar159;
                      auVar183._0_4_ = fVar159;
                      auVar183._8_4_ = fVar159;
                      auVar183._12_4_ = fVar159;
                      auVar83._8_8_ = uStack_508;
                      auVar83._0_8_ = local_510;
                      auVar103 = vfmadd132ps_fma(auVar183,auVar103,auVar83);
                      auVar163._4_4_ = fVar190;
                      auVar163._0_4_ = fVar190;
                      auVar163._8_4_ = fVar190;
                      auVar163._12_4_ = fVar190;
                      auVar103 = vfmadd213ps_fma(auVar163,auVar24,auVar103);
                      local_2d0 = auVar103._0_4_;
                      local_2c0 = vshufps_avx(auVar103,auVar103,0x55);
                      local_2b0 = vshufps_avx(auVar103,auVar103,0xaa);
                      iStack_2cc = local_2d0;
                      iStack_2c8 = local_2d0;
                      iStack_2c4 = local_2d0;
                      fStack_29c = local_2a0;
                      fStack_298 = local_2a0;
                      fStack_294 = local_2a0;
                      uStack_28c = local_290;
                      uStack_288 = local_290;
                      uStack_284 = local_290;
                      local_280 = local_4f0._0_8_;
                      uStack_278 = local_4f0._8_8_;
                      local_270 = local_4e0;
                      vpcmpeqd_avx2(ZEXT1632(local_4e0),ZEXT1632(local_4e0));
                      uStack_25c = (local_650.context)->instID[0];
                      local_260 = uStack_25c;
                      uStack_258 = uStack_25c;
                      uStack_254 = uStack_25c;
                      uStack_250 = (local_650.context)->instPrimID[0];
                      uStack_24c = uStack_250;
                      uStack_248 = uStack_250;
                      uStack_244 = uStack_250;
                      local_690 = local_450._0_8_;
                      uStack_688 = local_450._8_8_;
                      local_650.valid = (int *)&local_690;
                      local_650.geometryUserPtr = pGVar94->userPtr;
                      local_650.hit = (RTCHitN *)&local_2d0;
                      local_650.N = 4;
                      local_5b0._0_4_ = uVar93;
                      local_650.ray = (RTCRayN *)ray;
                      if (pGVar94->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar94->intersectionFilterN)(&local_650);
                        auVar225 = ZEXT3264(local_5a0);
                        auVar224 = ZEXT3264(local_580);
                        auVar219 = ZEXT3264(local_600);
                        auVar218 = ZEXT3264(local_5e0);
                        auVar220 = ZEXT3264(local_4a0);
                        in_ZMM21 = ZEXT3264(local_560);
                        in_ZMM20 = ZEXT3264(local_540);
                        auVar103 = vxorps_avx512vl(auVar221,auVar221);
                        auVar222 = ZEXT1664(auVar103);
                        pGVar94 = local_608;
                        uVar93 = local_5b0._0_4_;
                      }
                      bVar98 = (byte)uVar93;
                      auVar103 = auVar222._0_16_;
                      auVar76._8_8_ = uStack_688;
                      auVar76._0_8_ = local_690;
                      uVar92 = vptestmd_avx512vl(auVar76,auVar76);
                      if ((uVar92 & 0xf) == 0) {
LAB_01df7ec8:
                        *(undefined4 *)(ray + k * 4 + 0x80) = local_500;
                      }
                      else {
                        p_Var16 = context->args->filter;
                        if ((p_Var16 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar94->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var16)(&local_650);
                          bVar98 = local_5b0[0];
                          auVar225 = ZEXT3264(local_5a0);
                          auVar224 = ZEXT3264(local_580);
                          auVar219 = ZEXT3264(local_600);
                          auVar218 = ZEXT3264(local_5e0);
                          auVar220 = ZEXT3264(local_4a0);
                          in_ZMM21 = ZEXT3264(local_560);
                          in_ZMM20 = ZEXT3264(local_540);
                          auVar103 = vxorps_avx512vl(auVar103,auVar103);
                          auVar222 = ZEXT1664(auVar103);
                          pGVar94 = local_608;
                        }
                        auVar77._8_8_ = uStack_688;
                        auVar77._0_8_ = local_690;
                        uVar92 = vptestmd_avx512vl(auVar77,auVar77);
                        uVar92 = uVar92 & 0xf;
                        bVar88 = (byte)uVar92;
                        if (bVar88 == 0) goto LAB_01df7ec8;
                        iVar1 = *(int *)(local_650.hit + 4);
                        iVar2 = *(int *)(local_650.hit + 8);
                        iVar75 = *(int *)(local_650.hit + 0xc);
                        bVar17 = (bool)((byte)(uVar92 >> 1) & 1);
                        bVar18 = (bool)((byte)(uVar92 >> 2) & 1);
                        bVar19 = SUB81(uVar92 >> 3,0);
                        *(uint *)(local_650.ray + 0xc0) =
                             (uint)(bVar88 & 1) * *(int *)local_650.hit |
                             (uint)!(bool)(bVar88 & 1) * *(int *)(local_650.ray + 0xc0);
                        *(uint *)(local_650.ray + 0xc4) =
                             (uint)bVar17 * iVar1 | (uint)!bVar17 * *(int *)(local_650.ray + 0xc4);
                        *(uint *)(local_650.ray + 200) =
                             (uint)bVar18 * iVar2 | (uint)!bVar18 * *(int *)(local_650.ray + 200);
                        *(uint *)(local_650.ray + 0xcc) =
                             (uint)bVar19 * iVar75 | (uint)!bVar19 * *(int *)(local_650.ray + 0xcc);
                        iVar1 = *(int *)(local_650.hit + 0x14);
                        iVar2 = *(int *)(local_650.hit + 0x18);
                        iVar75 = *(int *)(local_650.hit + 0x1c);
                        bVar17 = (bool)((byte)(uVar92 >> 1) & 1);
                        bVar18 = (bool)((byte)(uVar92 >> 2) & 1);
                        bVar19 = SUB81(uVar92 >> 3,0);
                        *(uint *)(local_650.ray + 0xd0) =
                             (uint)(bVar88 & 1) * *(int *)(local_650.hit + 0x10) |
                             (uint)!(bool)(bVar88 & 1) * *(int *)(local_650.ray + 0xd0);
                        *(uint *)(local_650.ray + 0xd4) =
                             (uint)bVar17 * iVar1 | (uint)!bVar17 * *(int *)(local_650.ray + 0xd4);
                        *(uint *)(local_650.ray + 0xd8) =
                             (uint)bVar18 * iVar2 | (uint)!bVar18 * *(int *)(local_650.ray + 0xd8);
                        *(uint *)(local_650.ray + 0xdc) =
                             (uint)bVar19 * iVar75 | (uint)!bVar19 * *(int *)(local_650.ray + 0xdc);
                        iVar1 = *(int *)(local_650.hit + 0x24);
                        iVar2 = *(int *)(local_650.hit + 0x28);
                        iVar75 = *(int *)(local_650.hit + 0x2c);
                        bVar17 = (bool)((byte)(uVar92 >> 1) & 1);
                        bVar18 = (bool)((byte)(uVar92 >> 2) & 1);
                        bVar19 = SUB81(uVar92 >> 3,0);
                        *(uint *)(local_650.ray + 0xe0) =
                             (uint)(bVar88 & 1) * *(int *)(local_650.hit + 0x20) |
                             (uint)!(bool)(bVar88 & 1) * *(int *)(local_650.ray + 0xe0);
                        *(uint *)(local_650.ray + 0xe4) =
                             (uint)bVar17 * iVar1 | (uint)!bVar17 * *(int *)(local_650.ray + 0xe4);
                        *(uint *)(local_650.ray + 0xe8) =
                             (uint)bVar18 * iVar2 | (uint)!bVar18 * *(int *)(local_650.ray + 0xe8);
                        *(uint *)(local_650.ray + 0xec) =
                             (uint)bVar19 * iVar75 | (uint)!bVar19 * *(int *)(local_650.ray + 0xec);
                        iVar1 = *(int *)(local_650.hit + 0x34);
                        iVar2 = *(int *)(local_650.hit + 0x38);
                        iVar75 = *(int *)(local_650.hit + 0x3c);
                        bVar17 = (bool)((byte)(uVar92 >> 1) & 1);
                        bVar18 = (bool)((byte)(uVar92 >> 2) & 1);
                        bVar19 = SUB81(uVar92 >> 3,0);
                        *(uint *)(local_650.ray + 0xf0) =
                             (uint)(bVar88 & 1) * *(int *)(local_650.hit + 0x30) |
                             (uint)!(bool)(bVar88 & 1) * *(int *)(local_650.ray + 0xf0);
                        *(uint *)(local_650.ray + 0xf4) =
                             (uint)bVar17 * iVar1 | (uint)!bVar17 * *(int *)(local_650.ray + 0xf4);
                        *(uint *)(local_650.ray + 0xf8) =
                             (uint)bVar18 * iVar2 | (uint)!bVar18 * *(int *)(local_650.ray + 0xf8);
                        *(uint *)(local_650.ray + 0xfc) =
                             (uint)bVar19 * iVar75 | (uint)!bVar19 * *(int *)(local_650.ray + 0xfc);
                        auVar103 = *(undefined1 (*) [16])(local_650.ray + 0x100);
                        auVar106._0_4_ =
                             (uint)(bVar88 & 1) * *(int *)(local_650.hit + 0x40) |
                             (uint)!(bool)(bVar88 & 1) * auVar103._0_4_;
                        bVar17 = (bool)((byte)(uVar92 >> 1) & 1);
                        auVar106._4_4_ =
                             (uint)bVar17 * *(int *)(local_650.hit + 0x44) |
                             (uint)!bVar17 * auVar103._4_4_;
                        bVar17 = (bool)((byte)(uVar92 >> 2) & 1);
                        auVar106._8_4_ =
                             (uint)bVar17 * *(int *)(local_650.hit + 0x48) |
                             (uint)!bVar17 * auVar103._8_4_;
                        bVar17 = SUB81(uVar92 >> 3,0);
                        auVar106._12_4_ =
                             (uint)bVar17 * *(int *)(local_650.hit + 0x4c) |
                             (uint)!bVar17 * auVar103._12_4_;
                        *(undefined1 (*) [16])(local_650.ray + 0x100) = auVar106;
                        auVar103 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_650.hit + 0x50));
                        *(undefined1 (*) [16])(local_650.ray + 0x110) = auVar103;
                        auVar103 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_650.hit + 0x60));
                        *(undefined1 (*) [16])(local_650.ray + 0x120) = auVar103;
                        auVar103 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_650.hit + 0x70));
                        *(undefined1 (*) [16])(local_650.ray + 0x130) = auVar103;
                        auVar103 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_650.hit + 0x80));
                        *(undefined1 (*) [16])(local_650.ray + 0x140) = auVar103;
                      }
                      bVar98 = ~(byte)(1 << ((uint)uVar89 & 0x1f)) & bVar98;
                      uVar160 = *(undefined4 *)(ray + k * 4 + 0x80);
                      auVar37._4_4_ = uVar160;
                      auVar37._0_4_ = uVar160;
                      auVar37._8_4_ = uVar160;
                      auVar37._12_4_ = uVar160;
                      auVar37._16_4_ = uVar160;
                      auVar37._20_4_ = uVar160;
                      auVar37._24_4_ = uVar160;
                      auVar37._28_4_ = uVar160;
                      uVar161 = vcmpps_avx512vl(in_ZMM21._0_32_,auVar37,2);
                      bVar88 = bVar98 & (byte)uVar161;
                      uVar93 = (uint)bVar88;
                      if ((bVar98 & (byte)uVar161) != 0) {
                        auVar171._8_4_ = 0x7f800000;
                        auVar171._0_8_ = 0x7f8000007f800000;
                        auVar171._12_4_ = 0x7f800000;
                        auVar171._16_4_ = 0x7f800000;
                        auVar171._20_4_ = 0x7f800000;
                        auVar171._24_4_ = 0x7f800000;
                        auVar171._28_4_ = 0x7f800000;
                        auVar126 = vblendmps_avx512vl(auVar171,in_ZMM21._0_32_);
                        auVar149._0_4_ =
                             (uint)(bVar88 & 1) * auVar126._0_4_ |
                             (uint)!(bool)(bVar88 & 1) * 0x7f800000;
                        bVar17 = (bool)(bVar88 >> 1 & 1);
                        auVar149._4_4_ = (uint)bVar17 * auVar126._4_4_ | (uint)!bVar17 * 0x7f800000;
                        bVar17 = (bool)(bVar88 >> 2 & 1);
                        auVar149._8_4_ = (uint)bVar17 * auVar126._8_4_ | (uint)!bVar17 * 0x7f800000;
                        bVar17 = (bool)(bVar88 >> 3 & 1);
                        auVar149._12_4_ =
                             (uint)bVar17 * auVar126._12_4_ | (uint)!bVar17 * 0x7f800000;
                        bVar17 = (bool)(bVar88 >> 4 & 1);
                        auVar149._16_4_ =
                             (uint)bVar17 * auVar126._16_4_ | (uint)!bVar17 * 0x7f800000;
                        bVar17 = (bool)(bVar88 >> 5 & 1);
                        auVar149._20_4_ =
                             (uint)bVar17 * auVar126._20_4_ | (uint)!bVar17 * 0x7f800000;
                        bVar17 = (bool)(bVar88 >> 6 & 1);
                        auVar149._24_4_ =
                             (uint)bVar17 * auVar126._24_4_ | (uint)!bVar17 * 0x7f800000;
                        auVar149._28_4_ =
                             (uint)(bVar88 >> 7) * auVar126._28_4_ |
                             (uint)!(bool)(bVar88 >> 7) * 0x7f800000;
                        auVar126 = vshufps_avx(auVar149,auVar149,0xb1);
                        auVar126 = vminps_avx(auVar149,auVar126);
                        auVar127 = vshufpd_avx(auVar126,auVar126,5);
                        auVar126 = vminps_avx(auVar126,auVar127);
                        auVar127 = vpermpd_avx2(auVar126,0x4e);
                        auVar126 = vminps_avx(auVar126,auVar127);
                        uVar161 = vcmpps_avx512vl(auVar149,auVar126,0);
                        bVar98 = (byte)uVar161 & bVar88;
                        uVar91 = uVar93;
                        if (bVar98 != 0) {
                          uVar91 = (uint)bVar98;
                        }
                        uVar90 = 0;
                        for (; (uVar91 & 1) == 0; uVar91 = uVar91 >> 1 | 0x80000000) {
                          uVar90 = uVar90 + 1;
                        }
                        uVar89 = (ulong)uVar90;
                      }
                    } while (bVar88 != 0);
                  }
                }
              }
            }
          }
          auVar204 = ZEXT3264(auVar111);
          auVar188 = ZEXT3264(auVar113);
          lVar97 = lVar97 + 8;
        } while ((int)lVar97 < iVar14);
      }
      uVar160 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar32._4_4_ = uVar160;
      auVar32._0_4_ = uVar160;
      auVar32._8_4_ = uVar160;
      auVar32._12_4_ = uVar160;
      auVar32._16_4_ = uVar160;
      auVar32._20_4_ = uVar160;
      auVar32._24_4_ = uVar160;
      auVar32._28_4_ = uVar160;
      uVar161 = vcmpps_avx512vl(local_80,auVar32,2);
      uVar95 = (uint)uVar96 & (uint)uVar161;
      uVar96 = (ulong)uVar95;
    } while (uVar95 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }